

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float *pfVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  ulong uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  byte bVar60;
  byte bVar61;
  byte bVar62;
  long lVar63;
  uint uVar64;
  byte bVar65;
  uint uVar66;
  long lVar67;
  undefined1 uVar68;
  undefined1 uVar69;
  byte bVar70;
  ulong uVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar126;
  uint uVar127;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar129;
  uint uVar130;
  uint uVar131;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  uint uVar128;
  uint uVar132;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar133;
  float fVar134;
  vint4 bi_2;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar152;
  float fVar153;
  undefined4 uVar154;
  float fVar171;
  float fVar173;
  vint4 bi_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar167 [32];
  undefined1 auVar158 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  vint4 bi;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  vint4 ai_2;
  undefined1 auVar227 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [64];
  vint4 ai_1;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  vint4 ai;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined4 uVar253;
  undefined4 uVar254;
  undefined1 auVar252 [28];
  undefined4 uVar255;
  undefined4 uVar256;
  undefined4 uVar257;
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_a08;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9a0 [16];
  uint local_98c;
  float local_988;
  float local_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  RTCHitN local_460 [16];
  undefined1 auStack_450 [16];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  uint local_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar6 = prim[1];
  uVar72 = (ulong)(byte)PVar6;
  lVar67 = uVar72 * 0x25;
  fVar133 = *(float *)(prim + lVar67 + 0x12);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar79 = vsubps_avx(auVar79,*(undefined1 (*) [16])(prim + lVar67 + 6));
  auVar212._0_4_ = fVar133 * auVar79._0_4_;
  auVar212._4_4_ = fVar133 * auVar79._4_4_;
  auVar212._8_4_ = fVar133 * auVar79._8_4_;
  auVar212._12_4_ = fVar133 * auVar79._12_4_;
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  auVar135._0_4_ = fVar133 * auVar78._0_4_;
  auVar135._4_4_ = fVar133 * auVar78._4_4_;
  auVar135._8_4_ = fVar133 * auVar78._8_4_;
  auVar135._12_4_ = fVar133 * auVar78._12_4_;
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 5 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xf + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar72 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1a + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1b + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar272 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1c + 6)));
  auVar272 = vcvtdq2ps_avx(auVar272);
  auVar229._4_4_ = auVar135._0_4_;
  auVar229._0_4_ = auVar135._0_4_;
  auVar229._8_4_ = auVar135._0_4_;
  auVar229._12_4_ = auVar135._0_4_;
  auVar87 = vshufps_avx(auVar135,auVar135,0x55);
  auVar85 = vshufps_avx(auVar135,auVar135,0xaa);
  fVar133 = auVar85._0_4_;
  auVar183._0_4_ = fVar133 * auVar81._0_4_;
  fVar152 = auVar85._4_4_;
  auVar183._4_4_ = fVar152 * auVar81._4_4_;
  fVar171 = auVar85._8_4_;
  auVar183._8_4_ = fVar171 * auVar81._8_4_;
  fVar173 = auVar85._12_4_;
  auVar183._12_4_ = fVar173 * auVar81._12_4_;
  auVar155._0_4_ = auVar83._0_4_ * fVar133;
  auVar155._4_4_ = auVar83._4_4_ * fVar152;
  auVar155._8_4_ = auVar83._8_4_ * fVar171;
  auVar155._12_4_ = auVar83._12_4_ * fVar173;
  auVar136._0_4_ = auVar272._0_4_ * fVar133;
  auVar136._4_4_ = auVar272._4_4_ * fVar152;
  auVar136._8_4_ = auVar272._8_4_ * fVar171;
  auVar136._12_4_ = auVar272._12_4_ * fVar173;
  auVar85 = vfmadd231ps_fma(auVar183,auVar87,auVar78);
  auVar27 = vfmadd231ps_fma(auVar155,auVar87,auVar82);
  auVar87 = vfmadd231ps_fma(auVar136,auVar80,auVar87);
  auVar28 = vfmadd231ps_fma(auVar85,auVar229,auVar79);
  auVar27 = vfmadd231ps_fma(auVar27,auVar229,auVar86);
  auVar29 = vfmadd231ps_fma(auVar87,auVar84,auVar229);
  auVar260._4_4_ = auVar212._0_4_;
  auVar260._0_4_ = auVar212._0_4_;
  auVar260._8_4_ = auVar212._0_4_;
  auVar260._12_4_ = auVar212._0_4_;
  auVar87 = vshufps_avx(auVar212,auVar212,0x55);
  auVar262 = ZEXT1664(auVar87);
  auVar85 = vshufps_avx(auVar212,auVar212,0xaa);
  fVar133 = auVar85._0_4_;
  auVar230._0_4_ = fVar133 * auVar81._0_4_;
  fVar152 = auVar85._4_4_;
  auVar230._4_4_ = fVar152 * auVar81._4_4_;
  fVar171 = auVar85._8_4_;
  auVar230._8_4_ = fVar171 * auVar81._8_4_;
  fVar173 = auVar85._12_4_;
  auVar230._12_4_ = fVar173 * auVar81._12_4_;
  auVar218._0_4_ = auVar83._0_4_ * fVar133;
  auVar218._4_4_ = auVar83._4_4_ * fVar152;
  auVar218._8_4_ = auVar83._8_4_ * fVar171;
  auVar218._12_4_ = auVar83._12_4_ * fVar173;
  auVar213._0_4_ = auVar272._0_4_ * fVar133;
  auVar213._4_4_ = auVar272._4_4_ * fVar152;
  auVar213._8_4_ = auVar272._8_4_ * fVar171;
  auVar213._12_4_ = auVar272._12_4_ * fVar173;
  auVar78 = vfmadd231ps_fma(auVar230,auVar87,auVar78);
  auVar81 = vfmadd231ps_fma(auVar218,auVar87,auVar82);
  auVar82 = vfmadd231ps_fma(auVar213,auVar87,auVar80);
  auVar30 = vfmadd231ps_fma(auVar78,auVar260,auVar79);
  auVar135 = vfmadd231ps_fma(auVar81,auVar260,auVar86);
  auVar249._8_4_ = 0x7fffffff;
  auVar249._0_8_ = 0x7fffffff7fffffff;
  auVar249._12_4_ = 0x7fffffff;
  auVar136 = vfmadd231ps_fma(auVar82,auVar260,auVar84);
  auVar79 = vandps_avx(auVar249,auVar28);
  auVar246._8_4_ = 0x219392ef;
  auVar246._0_8_ = 0x219392ef219392ef;
  auVar246._12_4_ = 0x219392ef;
  uVar71 = vcmpps_avx512vl(auVar79,auVar246,1);
  bVar14 = (bool)((byte)uVar71 & 1);
  auVar75._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._0_4_;
  bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._4_4_;
  bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._8_4_;
  bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar28._12_4_;
  auVar79 = vandps_avx(auVar249,auVar27);
  uVar71 = vcmpps_avx512vl(auVar79,auVar246,1);
  bVar14 = (bool)((byte)uVar71 & 1);
  auVar76._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar27._0_4_;
  bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar27._4_4_;
  bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar27._8_4_;
  bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar27._12_4_;
  auVar79 = vandps_avx(auVar249,auVar29);
  uVar71 = vcmpps_avx512vl(auVar79,auVar246,1);
  bVar14 = (bool)((byte)uVar71 & 1);
  auVar77._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._0_4_;
  bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._4_4_;
  bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._8_4_;
  bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._12_4_;
  auVar78 = vrcp14ps_avx512vl(auVar75);
  auVar247._8_4_ = 0x3f800000;
  auVar247._0_8_ = 0x3f8000003f800000;
  auVar247._12_4_ = 0x3f800000;
  auVar79 = vfnmadd213ps_fma(auVar75,auVar78,auVar247);
  auVar28 = vfmadd132ps_fma(auVar79,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar76);
  auVar79 = vfnmadd213ps_fma(auVar76,auVar78,auVar247);
  auVar29 = vfmadd132ps_fma(auVar79,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar77);
  auVar79 = vfnmadd213ps_fma(auVar77,auVar78,auVar247);
  auVar26 = vfmadd132ps_fma(auVar79,auVar78,auVar78);
  fVar133 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar67 + 0x16)) *
            *(float *)(prim + lVar67 + 0x1a);
  auVar237._4_4_ = fVar133;
  auVar237._0_4_ = fVar133;
  auVar237._8_4_ = fVar133;
  auVar237._12_4_ = fVar133;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar79 = vpmovsxwd_avx(auVar79);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar78 = vpmovsxwd_avx(auVar78);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar86 = vsubps_avx(auVar78,auVar79);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar72 * 9 + 6);
  auVar78 = vpmovsxwd_avx(auVar81);
  auVar81 = vfmadd213ps_fma(auVar86,auVar237,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar78);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar72 * 0xd + 6);
  auVar78 = vpmovsxwd_avx(auVar86);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar79);
  auVar86 = vfmadd213ps_fma(auVar78,auVar237,auVar79);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar72 * 0x12 + 6);
  auVar79 = vpmovsxwd_avx(auVar82);
  auVar79 = vcvtdq2ps_avx(auVar79);
  uVar71 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar72 * 2 + uVar71 + 6);
  auVar78 = vpmovsxwd_avx(auVar83);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar79);
  auVar82 = vfmadd213ps_fma(auVar78,auVar237,auVar79);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar71 + 6);
  auVar79 = vpmovsxwd_avx(auVar84);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar72 * 0x18 + 6);
  auVar78 = vpmovsxwd_avx(auVar80);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar79);
  auVar83 = vfmadd213ps_fma(auVar78,auVar237,auVar79);
  auVar272._8_8_ = 0;
  auVar272._0_8_ = *(ulong *)(prim + uVar72 * 0x1d + 6);
  auVar79 = vpmovsxwd_avx(auVar272);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar72 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar78 = vpmovsxwd_avx(auVar87);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar79);
  auVar84 = vfmadd213ps_fma(auVar78,auVar237,auVar79);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar72) + 6);
  auVar79 = vpmovsxwd_avx(auVar85);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar72 * 0x23 + 6);
  auVar78 = vpmovsxwd_avx(auVar27);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar79);
  auVar78 = vfmadd213ps_fma(auVar78,auVar237,auVar79);
  auVar79 = vsubps_avx(auVar81,auVar30);
  auVar238._0_4_ = auVar28._0_4_ * auVar79._0_4_;
  auVar238._4_4_ = auVar28._4_4_ * auVar79._4_4_;
  auVar238._8_4_ = auVar28._8_4_ * auVar79._8_4_;
  auVar238._12_4_ = auVar28._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar86,auVar30);
  auVar184._0_4_ = auVar28._0_4_ * auVar79._0_4_;
  auVar184._4_4_ = auVar28._4_4_ * auVar79._4_4_;
  auVar184._8_4_ = auVar28._8_4_ * auVar79._8_4_;
  auVar184._12_4_ = auVar28._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar82,auVar135);
  auVar231._0_4_ = auVar29._0_4_ * auVar79._0_4_;
  auVar231._4_4_ = auVar29._4_4_ * auVar79._4_4_;
  auVar231._8_4_ = auVar29._8_4_ * auVar79._8_4_;
  auVar231._12_4_ = auVar29._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar83,auVar135);
  auVar156._0_4_ = auVar29._0_4_ * auVar79._0_4_;
  auVar156._4_4_ = auVar29._4_4_ * auVar79._4_4_;
  auVar156._8_4_ = auVar29._8_4_ * auVar79._8_4_;
  auVar156._12_4_ = auVar29._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar84,auVar136);
  auVar219._0_4_ = auVar26._0_4_ * auVar79._0_4_;
  auVar219._4_4_ = auVar26._4_4_ * auVar79._4_4_;
  auVar219._8_4_ = auVar26._8_4_ * auVar79._8_4_;
  auVar219._12_4_ = auVar26._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar78,auVar136);
  auVar137._0_4_ = auVar26._0_4_ * auVar79._0_4_;
  auVar137._4_4_ = auVar26._4_4_ * auVar79._4_4_;
  auVar137._8_4_ = auVar26._8_4_ * auVar79._8_4_;
  auVar137._12_4_ = auVar26._12_4_ * auVar79._12_4_;
  auVar79 = vpminsd_avx(auVar238,auVar184);
  auVar78 = vpminsd_avx(auVar231,auVar156);
  auVar79 = vmaxps_avx(auVar79,auVar78);
  auVar78 = vpminsd_avx(auVar219,auVar137);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar28._4_4_ = uVar154;
  auVar28._0_4_ = uVar154;
  auVar28._8_4_ = uVar154;
  auVar28._12_4_ = uVar154;
  auVar78 = vmaxps_avx512vl(auVar78,auVar28);
  auVar79 = vmaxps_avx(auVar79,auVar78);
  auVar29._8_4_ = 0x3f7ffffa;
  auVar29._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar29._12_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar79,auVar29);
  auVar79 = vpmaxsd_avx(auVar238,auVar184);
  auVar78 = vpmaxsd_avx(auVar231,auVar156);
  auVar79 = vminps_avx(auVar79,auVar78);
  auVar78 = vpmaxsd_avx(auVar219,auVar137);
  uVar154 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar26._4_4_ = uVar154;
  auVar26._0_4_ = uVar154;
  auVar26._8_4_ = uVar154;
  auVar26._12_4_ = uVar154;
  auVar78 = vminps_avx512vl(auVar78,auVar26);
  auVar79 = vminps_avx(auVar79,auVar78);
  auVar30._8_4_ = 0x3f800003;
  auVar30._0_8_ = 0x3f8000033f800003;
  auVar30._12_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar30);
  auVar78 = vpbroadcastd_avx512vl();
  uVar22 = vcmpps_avx512vl(local_320,auVar79,2);
  local_608 = vpcmpgtd_avx512vl(auVar78,_DAT_01f7fcf0);
  local_608 = ((byte)uVar22 & 0xf) & local_608;
  if ((char)local_608 == '\0') {
    return;
  }
  local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_610 = prim;
LAB_01bd735e:
  lVar67 = 0;
  for (uVar71 = local_608; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
    lVar67 = lVar67 + 1;
  }
  uVar66 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar67 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar66].ptr;
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar133 = (pGVar8->time_range).lower;
  fVar133 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar133) / ((pGVar8->time_range).upper - fVar133));
  auVar79 = vroundss_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),9);
  auVar79 = vminss_avx(auVar79,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,auVar79);
  fVar133 = fVar133 - auVar79._0_4_;
  fVar152 = 1.0 - fVar133;
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar63 = (long)(int)auVar79._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + 0x10 + lVar63);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar63);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar63);
  pfVar5 = (float *)(lVar11 + lVar12 * uVar71);
  auVar138._0_4_ = fVar133 * *pfVar5;
  auVar138._4_4_ = fVar133 * pfVar5[1];
  auVar138._8_4_ = fVar133 * pfVar5[2];
  auVar138._12_4_ = fVar133 * pfVar5[3];
  lVar67 = uVar71 + 1;
  pfVar5 = (float *)(lVar11 + lVar12 * lVar67);
  auVar157._0_4_ = fVar133 * *pfVar5;
  auVar157._4_4_ = fVar133 * pfVar5[1];
  auVar157._8_4_ = fVar133 * pfVar5[2];
  auVar157._12_4_ = fVar133 * pfVar5[3];
  p_Var13 = pGVar8[4].occlusionFilterN;
  auVar185._4_4_ = fVar152;
  auVar185._0_4_ = fVar152;
  auVar185._8_4_ = fVar152;
  auVar185._12_4_ = fVar152;
  auVar86 = vfmadd231ps_fma(auVar138,auVar185,
                            *(undefined1 (*) [16])(*(long *)(_Var9 + lVar63) + lVar10 * uVar71));
  auVar82 = vfmadd231ps_fma(auVar157,auVar185,
                            *(undefined1 (*) [16])(*(long *)(_Var9 + lVar63) + lVar10 * lVar67));
  pfVar5 = (float *)(*(long *)(p_Var13 + lVar63 + 0x38) +
                    uVar71 * *(long *)(p_Var13 + lVar63 + 0x48));
  auVar220._0_4_ = fVar133 * *pfVar5;
  auVar220._4_4_ = fVar133 * pfVar5[1];
  auVar220._8_4_ = fVar133 * pfVar5[2];
  auVar220._12_4_ = fVar133 * pfVar5[3];
  pfVar5 = (float *)(*(long *)(p_Var13 + lVar63 + 0x38) +
                    *(long *)(p_Var13 + lVar63 + 0x48) * lVar67);
  auVar214._0_4_ = fVar133 * *pfVar5;
  auVar214._4_4_ = fVar133 * pfVar5[1];
  auVar214._8_4_ = fVar133 * pfVar5[2];
  auVar214._12_4_ = fVar133 * pfVar5[3];
  auVar81 = vfmadd231ps_fma(auVar220,auVar185,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var13 + lVar63) +
                             *(long *)(p_Var13 + lVar63 + 0x10) * uVar71));
  auVar83 = vfmadd231ps_fma(auVar214,auVar185,
                            *(undefined1 (*) [16])
                             (*(long *)(p_Var13 + lVar63) +
                             *(long *)(p_Var13 + lVar63 + 0x10) * lVar67));
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar78 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  _local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar79 = vunpcklps_avx512vl(local_380._0_16_,local_3a0._0_16_);
  local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar272 = local_3c0._0_16_;
  local_6f0 = vinsertps_avx512f(auVar79,auVar272,0x28);
  auVar232._8_4_ = 0xbeaaaaab;
  auVar232._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar232._12_4_ = 0xbeaaaaab;
  auVar84 = vfnmadd213ps_fma(auVar81,auVar232,auVar86);
  auVar81 = vfmadd213ps_fma(auVar83,auVar232,auVar82);
  auVar233._0_4_ = auVar82._0_4_ + auVar86._0_4_ + auVar84._0_4_ + auVar81._0_4_;
  auVar233._4_4_ = auVar82._4_4_ + auVar86._4_4_ + auVar84._4_4_ + auVar81._4_4_;
  auVar233._8_4_ = auVar82._8_4_ + auVar86._8_4_ + auVar84._8_4_ + auVar81._8_4_;
  auVar233._12_4_ = auVar82._12_4_ + auVar86._12_4_ + auVar84._12_4_ + auVar81._12_4_;
  auVar31._8_4_ = 0x3e800000;
  auVar31._0_8_ = 0x3e8000003e800000;
  auVar31._12_4_ = 0x3e800000;
  auVar79 = vmulps_avx512vl(auVar233,auVar31);
  auVar79 = vsubps_avx(auVar79,auVar78);
  auVar79 = vdpps_avx(auVar79,local_6f0,0x7f);
  fVar133 = *(float *)(ray + k * 4 + 0x30);
  local_700 = vdpps_avx(local_6f0,local_6f0,0x7f);
  auVar239._4_12_ = ZEXT812(0) << 0x20;
  auVar239._0_4_ = local_700._0_4_;
  auVar80 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar239);
  auVar83 = vfnmadd213ss_fma(auVar80,local_700,ZEXT416(0x40000000));
  local_260 = auVar79._0_4_ * auVar80._0_4_ * auVar83._0_4_;
  auVar240._4_4_ = local_260;
  auVar240._0_4_ = local_260;
  auVar240._8_4_ = local_260;
  auVar240._12_4_ = local_260;
  fStack_6b0 = local_260;
  _local_6c0 = auVar240;
  fStack_6ac = local_260;
  fStack_6a8 = local_260;
  fStack_6a4 = local_260;
  auVar79 = vfmadd231ps_fma(auVar78,local_6f0,auVar240);
  auVar79 = vblendps_avx(auVar79,ZEXT816(0) << 0x40,8);
  auVar78 = vsubps_avx(auVar86,auVar79);
  auVar81 = vsubps_avx(auVar81,auVar79);
  auVar86 = vsubps_avx(auVar84,auVar79);
  auVar79 = vsubps_avx(auVar82,auVar79);
  auVar88 = vbroadcastss_avx512vl(auVar78);
  auVar274 = ZEXT3264(auVar88);
  auVar90._8_4_ = 1;
  auVar90._0_8_ = 0x100000001;
  auVar90._12_4_ = 1;
  auVar90._16_4_ = 1;
  auVar90._20_4_ = 1;
  auVar90._24_4_ = 1;
  auVar90._28_4_ = 1;
  local_580 = ZEXT1632(auVar78);
  local_880 = vpermps_avx2(auVar90,local_580);
  auVar250 = ZEXT3264(local_880);
  auVar91._8_4_ = 2;
  auVar91._0_8_ = 0x200000002;
  auVar91._12_4_ = 2;
  auVar91._16_4_ = 2;
  auVar91._20_4_ = 2;
  auVar91._24_4_ = 2;
  auVar91._28_4_ = 2;
  local_860 = vpermps_avx2(auVar91,local_580);
  auVar251 = ZEXT3264(local_860);
  auVar92._8_4_ = 3;
  auVar92._0_8_ = 0x300000003;
  auVar92._12_4_ = 3;
  auVar92._16_4_ = 3;
  auVar92._20_4_ = 3;
  auVar92._24_4_ = 3;
  auVar92._28_4_ = 3;
  local_8a0 = vpermps_avx2(auVar92,local_580);
  auVar259 = ZEXT3264(local_8a0);
  uVar154 = auVar86._0_4_;
  local_560._4_4_ = uVar154;
  local_560._0_4_ = uVar154;
  local_560._8_4_ = uVar154;
  local_560._12_4_ = uVar154;
  local_560._16_4_ = uVar154;
  local_560._20_4_ = uVar154;
  local_560._24_4_ = uVar154;
  local_560._28_4_ = uVar154;
  auVar245 = ZEXT3264(local_560);
  local_5c0 = ZEXT1632(auVar86);
  local_6e0 = vpermps_avx2(auVar90,local_5c0);
  local_7c0 = vpermps_avx512vl(auVar91,local_5c0);
  auVar273 = ZEXT3264(local_7c0);
  local_8c0 = vpermps_avx512vl(auVar92,local_5c0);
  auVar271 = ZEXT3264(local_8c0);
  auVar228 = ZEXT3264(local_6e0);
  local_8e0 = vbroadcastss_avx512vl(auVar81);
  auVar263 = ZEXT3264(local_8e0);
  local_5a0 = ZEXT1632(auVar81);
  local_900 = vpermps_avx512vl(auVar90,local_5a0);
  auVar264 = ZEXT3264(local_900);
  local_920 = vpermps_avx512vl(auVar91,local_5a0);
  auVar265 = ZEXT3264(local_920);
  local_7e0 = vpermps_avx512vl(auVar92,local_5a0);
  auVar266 = ZEXT3264(local_7e0);
  local_940 = vbroadcastss_avx512vl(auVar79);
  auVar267 = ZEXT3264(local_940);
  _local_5e0 = ZEXT1632(auVar79);
  local_800 = vpermps_avx512vl(auVar90,_local_5e0);
  auVar268 = ZEXT3264(local_800);
  local_960 = vpermps_avx512vl(auVar91,_local_5e0);
  auVar269 = ZEXT3264(local_960);
  local_980 = vpermps_avx512vl(auVar92,_local_5e0);
  auVar270 = ZEXT3264(local_980);
  auVar79 = vmulss_avx512f(auVar272,auVar272);
  auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),local_3a0,local_3a0);
  local_240 = vfmadd231ps_avx512vl(auVar88,_local_380,_local_380);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar88._8_4_ = 0x7fffffff;
  auVar88._0_8_ = 0x7fffffff7fffffff;
  auVar88._12_4_ = 0x7fffffff;
  auVar88._16_4_ = 0x7fffffff;
  auVar88._20_4_ = 0x7fffffff;
  auVar88._24_4_ = 0x7fffffff;
  auVar88._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar88);
  local_660 = ZEXT416((uint)local_260);
  local_260 = fVar133 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_470 = vpbroadcastd_avx512vl();
  uVar64 = 0;
  local_a08 = 1;
  local_480 = vpbroadcastd_avx512vl();
  auVar79 = vsqrtss_avx(local_700,local_700);
  local_984 = auVar79._0_4_;
  auVar79 = vsqrtss_avx(local_700,local_700);
  local_988 = auVar79._0_4_;
  local_310 = ZEXT816(0x3f80000000000000);
  do {
    auVar79 = vmovshdup_avx(local_310);
    auVar79 = vsubps_avx(auVar79,local_310);
    fVar152 = auVar79._0_4_;
    fVar134 = fVar152 * 0.04761905;
    auVar217._0_4_ = local_310._0_4_;
    auVar217._4_4_ = auVar217._0_4_;
    auVar217._8_4_ = auVar217._0_4_;
    auVar217._12_4_ = auVar217._0_4_;
    auVar217._16_4_ = auVar217._0_4_;
    auVar217._20_4_ = auVar217._0_4_;
    auVar217._24_4_ = auVar217._0_4_;
    auVar217._28_4_ = auVar217._0_4_;
    local_7a0._4_4_ = fVar152;
    local_7a0._0_4_ = fVar152;
    local_7a0._8_4_ = fVar152;
    local_7a0._12_4_ = fVar152;
    local_7a0._16_4_ = fVar152;
    local_7a0._20_4_ = fVar152;
    local_7a0._24_4_ = fVar152;
    local_7a0._28_4_ = fVar152;
    auVar79 = vfmadd231ps_fma(auVar217,local_7a0,_DAT_01faff20);
    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar88 = vsubps_avx512vl(auVar89,ZEXT1632(auVar79));
    fVar152 = auVar79._0_4_;
    fVar171 = auVar79._4_4_;
    auVar104._4_4_ = auVar245._4_4_ * fVar171;
    auVar104._0_4_ = auVar245._0_4_ * fVar152;
    fVar173 = auVar79._8_4_;
    auVar104._8_4_ = auVar245._8_4_ * fVar173;
    fVar175 = auVar79._12_4_;
    auVar104._12_4_ = auVar245._12_4_ * fVar175;
    auVar104._16_4_ = auVar245._16_4_ * 0.0;
    auVar104._20_4_ = auVar245._20_4_ * 0.0;
    auVar104._24_4_ = auVar245._24_4_ * 0.0;
    auVar104._28_4_ = DAT_01faff20._28_4_;
    auVar94 = ZEXT1632(auVar79);
    auVar93._4_4_ = auVar228._4_4_ * fVar171;
    auVar93._0_4_ = auVar228._0_4_ * fVar152;
    auVar93._8_4_ = auVar228._8_4_ * fVar173;
    auVar93._12_4_ = auVar228._12_4_ * fVar175;
    auVar93._16_4_ = auVar228._16_4_ * 0.0;
    auVar93._20_4_ = auVar228._20_4_ * 0.0;
    auVar93._24_4_ = auVar228._24_4_ * 0.0;
    auVar93._28_4_ = auVar217._0_4_;
    auVar90 = vmulps_avx512vl(auVar273._0_32_,auVar94);
    auVar91 = vmulps_avx512vl(auVar271._0_32_,auVar94);
    local_740 = auVar274._0_32_;
    auVar92 = vfmadd231ps_avx512vl(auVar104,auVar88,local_740);
    auVar78 = vfmadd231ps_fma(auVar93,auVar88,auVar250._0_32_);
    auVar81 = vfmadd231ps_fma(auVar90,auVar88,auVar251._0_32_);
    auVar86 = vfmadd231ps_fma(auVar91,auVar88,auVar259._0_32_);
    auVar90 = vmulps_avx512vl(auVar263._0_32_,auVar94);
    auVar97 = ZEXT1632(auVar79);
    auVar91 = vmulps_avx512vl(auVar264._0_32_,auVar97);
    auVar93 = vmulps_avx512vl(auVar265._0_32_,auVar97);
    auVar94 = vmulps_avx512vl(auVar266._0_32_,auVar97);
    auVar82 = vfmadd231ps_fma(auVar90,auVar88,auVar245._0_32_);
    auVar83 = vfmadd231ps_fma(auVar91,auVar88,auVar228._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar93,auVar88,auVar273._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar94,auVar88,auVar271._0_32_);
    auVar93 = vmulps_avx512vl(auVar267._0_32_,auVar97);
    auVar94 = vmulps_avx512vl(auVar268._0_32_,auVar97);
    auVar95 = vmulps_avx512vl(auVar269._0_32_,auVar97);
    auVar96 = vmulps_avx512vl(auVar270._0_32_,auVar97);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,auVar263._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar88,auVar264._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar88,auVar265._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar88,auVar266._0_32_);
    auVar262._0_28_ =
         ZEXT1628(CONCAT412(fVar175 * auVar82._12_4_,
                            CONCAT48(fVar173 * auVar82._8_4_,
                                     CONCAT44(fVar171 * auVar82._4_4_,fVar152 * auVar82._0_4_))));
    auVar97 = vmulps_avx512vl(auVar97,ZEXT1632(auVar83));
    auVar98 = vmulps_avx512vl(ZEXT1632(auVar79),auVar90);
    auVar99 = vmulps_avx512vl(ZEXT1632(auVar79),auVar91);
    auVar79 = vfmadd231ps_fma(auVar262._0_32_,auVar88,auVar92);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar88,ZEXT1632(auVar78));
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,ZEXT1632(auVar81));
    auVar100 = vfmadd231ps_avx512vl(auVar99,auVar88,ZEXT1632(auVar86));
    auVar106._0_4_ = auVar93._0_4_ * fVar152;
    auVar106._4_4_ = auVar93._4_4_ * fVar171;
    auVar106._8_4_ = auVar93._8_4_ * fVar173;
    auVar106._12_4_ = auVar93._12_4_ * fVar175;
    auVar106._16_4_ = auVar93._16_4_ * 0.0;
    auVar106._20_4_ = auVar93._20_4_ * 0.0;
    auVar106._24_4_ = auVar93._24_4_ * 0.0;
    auVar106._28_4_ = 0;
    auVar99._4_4_ = auVar94._4_4_ * fVar171;
    auVar99._0_4_ = auVar94._0_4_ * fVar152;
    auVar99._8_4_ = auVar94._8_4_ * fVar173;
    auVar99._12_4_ = auVar94._12_4_ * fVar175;
    auVar99._16_4_ = auVar94._16_4_ * 0.0;
    auVar99._20_4_ = auVar94._20_4_ * 0.0;
    auVar99._24_4_ = auVar94._24_4_ * 0.0;
    auVar99._28_4_ = auVar93._28_4_;
    auVar101._4_4_ = auVar95._4_4_ * fVar171;
    auVar101._0_4_ = auVar95._0_4_ * fVar152;
    auVar101._8_4_ = auVar95._8_4_ * fVar173;
    auVar101._12_4_ = auVar95._12_4_ * fVar175;
    auVar101._16_4_ = auVar95._16_4_ * 0.0;
    auVar101._20_4_ = auVar95._20_4_ * 0.0;
    auVar101._24_4_ = auVar95._24_4_ * 0.0;
    auVar101._28_4_ = auVar94._28_4_;
    auVar102._4_4_ = auVar96._4_4_ * fVar171;
    auVar102._0_4_ = auVar96._0_4_ * fVar152;
    auVar102._8_4_ = auVar96._8_4_ * fVar173;
    auVar102._12_4_ = auVar96._12_4_ * fVar175;
    auVar102._16_4_ = auVar96._16_4_ * 0.0;
    auVar102._20_4_ = auVar96._20_4_ * 0.0;
    auVar102._24_4_ = auVar96._24_4_ * 0.0;
    auVar102._28_4_ = auVar95._28_4_;
    auVar78 = vfmadd231ps_fma(auVar106,auVar88,ZEXT1632(auVar82));
    auVar81 = vfmadd231ps_fma(auVar99,auVar88,ZEXT1632(auVar83));
    auVar86 = vfmadd231ps_fma(auVar101,auVar88,auVar90);
    auVar82 = vfmadd231ps_fma(auVar102,auVar88,auVar91);
    auVar103._28_4_ = auVar92._28_4_;
    auVar103._0_28_ =
         ZEXT1628(CONCAT412(auVar86._12_4_ * fVar175,
                            CONCAT48(auVar86._8_4_ * fVar173,
                                     CONCAT44(auVar86._4_4_ * fVar171,auVar86._0_4_ * fVar152))));
    auVar83 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar175 * auVar78._12_4_,
                                                 CONCAT48(fVar173 * auVar78._8_4_,
                                                          CONCAT44(fVar171 * auVar78._4_4_,
                                                                   fVar152 * auVar78._0_4_)))),
                              auVar88,ZEXT1632(auVar79));
    auVar99 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar175,
                                            CONCAT48(auVar81._8_4_ * fVar173,
                                                     CONCAT44(auVar81._4_4_ * fVar171,
                                                              auVar81._0_4_ * fVar152)))),auVar88,
                         auVar97);
    auVar101 = vfmadd231ps_avx512vl(auVar103,auVar88,auVar98);
    auVar90 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar82._12_4_ * fVar175,
                                            CONCAT48(auVar82._8_4_ * fVar173,
                                                     CONCAT44(auVar82._4_4_ * fVar171,
                                                              auVar82._0_4_ * fVar152)))),auVar100,
                         auVar88);
    auVar88 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar79));
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar81),auVar97);
    auVar92 = vsubps_avx512vl(ZEXT1632(auVar86),auVar98);
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar82),auVar100);
    auVar116._0_4_ = fVar134 * auVar88._0_4_ * 3.0;
    auVar116._4_4_ = fVar134 * auVar88._4_4_ * 3.0;
    auVar116._8_4_ = fVar134 * auVar88._8_4_ * 3.0;
    auVar116._12_4_ = fVar134 * auVar88._12_4_ * 3.0;
    auVar116._16_4_ = fVar134 * auVar88._16_4_ * 3.0;
    auVar116._20_4_ = fVar134 * auVar88._20_4_ * 3.0;
    auVar116._24_4_ = fVar134 * auVar88._24_4_ * 3.0;
    auVar116._28_4_ = 0;
    auVar146._0_4_ = fVar134 * auVar91._0_4_ * 3.0;
    auVar146._4_4_ = fVar134 * auVar91._4_4_ * 3.0;
    auVar146._8_4_ = fVar134 * auVar91._8_4_ * 3.0;
    auVar146._12_4_ = fVar134 * auVar91._12_4_ * 3.0;
    auVar146._16_4_ = fVar134 * auVar91._16_4_ * 3.0;
    auVar146._20_4_ = fVar134 * auVar91._20_4_ * 3.0;
    auVar146._24_4_ = fVar134 * auVar91._24_4_ * 3.0;
    auVar146._28_4_ = 0;
    auVar100._4_4_ = fVar134 * auVar92._4_4_ * 3.0;
    auVar100._0_4_ = fVar134 * auVar92._0_4_ * 3.0;
    auVar100._8_4_ = fVar134 * auVar92._8_4_ * 3.0;
    auVar100._12_4_ = fVar134 * auVar92._12_4_ * 3.0;
    auVar100._16_4_ = fVar134 * auVar92._16_4_ * 3.0;
    auVar100._20_4_ = fVar134 * auVar92._20_4_ * 3.0;
    auVar100._24_4_ = fVar134 * auVar92._24_4_ * 3.0;
    auVar100._28_4_ = auVar96._28_4_;
    fVar152 = auVar93._0_4_ * 3.0 * fVar134;
    fVar171 = auVar93._4_4_ * 3.0 * fVar134;
    auVar108._4_4_ = fVar171;
    auVar108._0_4_ = fVar152;
    fVar173 = auVar93._8_4_ * 3.0 * fVar134;
    auVar108._8_4_ = fVar173;
    fVar175 = auVar93._12_4_ * 3.0 * fVar134;
    auVar108._12_4_ = fVar175;
    fVar177 = auVar93._16_4_ * 3.0 * fVar134;
    auVar108._16_4_ = fVar177;
    fVar179 = auVar93._20_4_ * 3.0 * fVar134;
    auVar108._20_4_ = fVar179;
    fVar181 = auVar93._24_4_ * 3.0 * fVar134;
    auVar108._24_4_ = fVar181;
    auVar108._28_4_ = fVar134;
    auVar79 = vxorps_avx512vl(auVar271._0_16_,auVar271._0_16_);
    auVar102 = vpermt2ps_avx512vl(ZEXT1632(auVar83),_DAT_01feed00,ZEXT1632(auVar79));
    auVar103 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,ZEXT1632(auVar79));
    auVar91 = ZEXT1632(auVar79);
    auVar104 = vpermt2ps_avx512vl(auVar101,_DAT_01feed00,auVar91);
    auVar105._0_4_ = auVar90._0_4_ + fVar152;
    auVar105._4_4_ = auVar90._4_4_ + fVar171;
    auVar105._8_4_ = auVar90._8_4_ + fVar173;
    auVar105._12_4_ = auVar90._12_4_ + fVar175;
    auVar105._16_4_ = auVar90._16_4_ + fVar177;
    auVar105._20_4_ = auVar90._20_4_ + fVar179;
    auVar105._24_4_ = auVar90._24_4_ + fVar181;
    auVar105._28_4_ = auVar90._28_4_ + fVar134;
    auVar88 = vmaxps_avx(auVar90,auVar105);
    auVar94 = vminps_avx512vl(auVar90,auVar105);
    auVar95 = vpermt2ps_avx512vl(auVar90,_DAT_01feed00,auVar91);
    auVar105 = vpermt2ps_avx512vl(auVar116,_DAT_01feed00,auVar91);
    auVar106 = vpermt2ps_avx512vl(auVar146,_DAT_01feed00,auVar91);
    auVar113 = ZEXT1632(auVar79);
    auVar107 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,auVar113);
    auVar90 = vpermt2ps_avx512vl(auVar108,_DAT_01feed00,auVar113);
    auVar90 = vsubps_avx(auVar95,auVar90);
    auVar91 = vsubps_avx(auVar102,ZEXT1632(auVar83));
    auVar92 = vsubps_avx(auVar103,auVar99);
    auVar93 = vsubps_avx(auVar104,auVar101);
    auVar96 = vmulps_avx512vl(auVar92,auVar100);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar146,auVar93);
    auVar97 = vmulps_avx512vl(auVar93,auVar116);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar100,auVar91);
    auVar98 = vmulps_avx512vl(auVar91,auVar146);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar116,auVar92);
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar97);
    auVar96 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar96);
    auVar97 = vmulps_avx512vl(auVar93,auVar93);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,auVar92);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar91,auVar91);
    auVar98 = vrcp14ps_avx512vl(auVar97);
    auVar108 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar89);
    auVar98 = vfmadd132ps_avx512vl(auVar108,auVar98,auVar98);
    auVar96 = vmulps_avx512vl(auVar96,auVar98);
    auVar108 = vmulps_avx512vl(auVar92,auVar107);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar106,auVar93);
    auVar109 = vmulps_avx512vl(auVar93,auVar105);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar107,auVar91);
    auVar110 = vmulps_avx512vl(auVar91,auVar106);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar105,auVar92);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar98 = vmulps_avx512vl(auVar108,auVar98);
    auVar96 = vmaxps_avx512vl(auVar96,auVar98);
    auVar96 = vsqrtps_avx512vl(auVar96);
    auVar98 = vmaxps_avx512vl(auVar90,auVar95);
    auVar88 = vmaxps_avx512vl(auVar88,auVar98);
    auVar98 = vaddps_avx512vl(auVar96,auVar88);
    auVar88 = vminps_avx(auVar90,auVar95);
    auVar88 = vminps_avx512vl(auVar94,auVar88);
    auVar88 = vsubps_avx512vl(auVar88,auVar96);
    auVar94._8_4_ = 0x3f800002;
    auVar94._0_8_ = 0x3f8000023f800002;
    auVar94._12_4_ = 0x3f800002;
    auVar94._16_4_ = 0x3f800002;
    auVar94._20_4_ = 0x3f800002;
    auVar94._24_4_ = 0x3f800002;
    auVar94._28_4_ = 0x3f800002;
    auVar90 = vmulps_avx512vl(auVar98,auVar94);
    auVar95._8_4_ = 0x3f7ffffc;
    auVar95._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar95._12_4_ = 0x3f7ffffc;
    auVar95._16_4_ = 0x3f7ffffc;
    auVar95._20_4_ = 0x3f7ffffc;
    auVar95._24_4_ = 0x3f7ffffc;
    auVar95._28_4_ = 0x3f7ffffc;
    local_760 = vmulps_avx512vl(auVar88,auVar95);
    auVar88 = vmulps_avx512vl(auVar90,auVar90);
    auVar90 = vrsqrt14ps_avx512vl(auVar97);
    auVar96._8_4_ = 0xbf000000;
    auVar96._0_8_ = 0xbf000000bf000000;
    auVar96._12_4_ = 0xbf000000;
    auVar96._16_4_ = 0xbf000000;
    auVar96._20_4_ = 0xbf000000;
    auVar96._24_4_ = 0xbf000000;
    auVar96._28_4_ = 0xbf000000;
    auVar94 = vmulps_avx512vl(auVar97,auVar96);
    fVar152 = auVar90._0_4_;
    fVar171 = auVar90._4_4_;
    fVar173 = auVar90._8_4_;
    fVar175 = auVar90._12_4_;
    fVar134 = auVar90._16_4_;
    fVar177 = auVar90._20_4_;
    fVar179 = auVar90._24_4_;
    auVar109._4_4_ = fVar171 * fVar171 * fVar171 * auVar94._4_4_;
    auVar109._0_4_ = fVar152 * fVar152 * fVar152 * auVar94._0_4_;
    auVar109._8_4_ = fVar173 * fVar173 * fVar173 * auVar94._8_4_;
    auVar109._12_4_ = fVar175 * fVar175 * fVar175 * auVar94._12_4_;
    auVar109._16_4_ = fVar134 * fVar134 * fVar134 * auVar94._16_4_;
    auVar109._20_4_ = fVar177 * fVar177 * fVar177 * auVar94._20_4_;
    auVar109._24_4_ = fVar179 * fVar179 * fVar179 * auVar94._24_4_;
    auVar109._28_4_ = auVar98._28_4_;
    auVar97._8_4_ = 0x3fc00000;
    auVar97._0_8_ = 0x3fc000003fc00000;
    auVar97._12_4_ = 0x3fc00000;
    auVar97._16_4_ = 0x3fc00000;
    auVar97._20_4_ = 0x3fc00000;
    auVar97._24_4_ = 0x3fc00000;
    auVar97._28_4_ = 0x3fc00000;
    auVar90 = vfmadd231ps_avx512vl(auVar109,auVar90,auVar97);
    auVar262 = ZEXT3264(auVar90);
    auVar94 = vmulps_avx512vl(auVar91,auVar90);
    auVar95 = vmulps_avx512vl(auVar92,auVar90);
    auVar96 = vmulps_avx512vl(auVar93,auVar90);
    auVar227 = ZEXT1632(auVar83);
    auVar97 = vsubps_avx512vl(auVar113,auVar227);
    auVar108 = vsubps_avx512vl(auVar113,auVar99);
    auVar109 = vsubps_avx512vl(auVar113,auVar101);
    auVar98 = vmulps_avx512vl(local_3c0,auVar109);
    auVar98 = vfmadd231ps_avx512vl(auVar98,local_3a0,auVar108);
    auVar98 = vfmadd231ps_avx512vl(auVar98,_local_380,auVar97);
    auVar110 = vmulps_avx512vl(auVar109,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar97,auVar97);
    auVar111 = vmulps_avx512vl(local_3c0,auVar96);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar95,local_3a0);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar94,_local_380);
    auVar96 = vmulps_avx512vl(auVar109,auVar96);
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar108,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar97,auVar94);
    auVar95 = vmulps_avx512vl(auVar111,auVar111);
    auVar96 = vsubps_avx512vl(local_220,auVar95);
    auVar112 = vmulps_avx512vl(auVar111,auVar94);
    auVar98 = vsubps_avx512vl(auVar98,auVar112);
    auVar112 = vaddps_avx512vl(auVar98,auVar98);
    auVar98 = vmulps_avx512vl(auVar94,auVar94);
    local_780 = vsubps_avx512vl(auVar110,auVar98);
    auVar88 = vsubps_avx512vl(local_780,auVar88);
    local_680 = vmulps_avx512vl(auVar112,auVar112);
    auVar98._8_4_ = 0x40800000;
    auVar98._0_8_ = 0x4080000040800000;
    auVar98._12_4_ = 0x40800000;
    auVar98._16_4_ = 0x40800000;
    auVar98._20_4_ = 0x40800000;
    auVar98._24_4_ = 0x40800000;
    auVar98._28_4_ = 0x40800000;
    _local_4c0 = vmulps_avx512vl(auVar96,auVar98);
    auVar98 = vmulps_avx512vl(_local_4c0,auVar88);
    auVar98 = vsubps_avx512vl(local_680,auVar98);
    uVar71 = vcmpps_avx512vl(auVar98,auVar113,5);
    bVar60 = (byte)uVar71;
    fVar152 = (float)local_6c0._0_4_;
    fVar171 = (float)local_6c0._4_4_;
    fVar173 = fStack_6b8;
    fVar175 = fStack_6b4;
    fVar134 = fStack_6b0;
    fVar177 = fStack_6ac;
    fVar179 = fStack_6a8;
    fVar181 = fStack_6a4;
    if (bVar60 == 0) {
LAB_01bd806e:
      auVar250 = ZEXT3264(local_880);
      auVar251 = ZEXT3264(local_860);
      auVar259 = ZEXT3264(local_8a0);
      auVar245 = ZEXT3264(local_560);
      auVar228 = ZEXT3264(local_6e0);
      auVar273 = ZEXT3264(local_7c0);
      auVar271 = ZEXT3264(local_8c0);
      auVar263 = ZEXT3264(local_8e0);
      auVar264 = ZEXT3264(local_900);
      auVar265 = ZEXT3264(local_920);
      auVar266 = ZEXT3264(local_7e0);
      auVar267 = ZEXT3264(local_940);
      auVar268 = ZEXT3264(local_800);
      auVar269 = ZEXT3264(local_960);
      auVar270 = ZEXT3264(local_980);
    }
    else {
      auVar98 = vsqrtps_avx512vl(auVar98);
      auVar113 = vaddps_avx512vl(auVar96,auVar96);
      local_6a0 = vrcp14ps_avx512vl(auVar113);
      auVar89 = vfnmadd213ps_avx512vl(local_6a0,auVar113,auVar89);
      auVar110 = vfmadd132ps_avx512vl(auVar89,local_6a0,local_6a0);
      auVar89._8_4_ = 0x80000000;
      auVar89._0_8_ = 0x8000000080000000;
      auVar89._12_4_ = 0x80000000;
      auVar89._16_4_ = 0x80000000;
      auVar89._20_4_ = 0x80000000;
      auVar89._24_4_ = 0x80000000;
      auVar89._28_4_ = 0x80000000;
      local_720 = vxorps_avx512vl(auVar112,auVar89);
      auVar89 = vsubps_avx512vl(local_720,auVar98);
      local_4e0 = vmulps_avx512vl(auVar89,auVar110);
      auVar98 = vsubps_avx512vl(auVar98,auVar112);
      local_500 = vmulps_avx512vl(auVar98,auVar110);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar89 = vblendmps_avx512vl(auVar98,local_4e0);
      auVar114._0_4_ =
           (uint)(bVar60 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar98._0_4_;
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar98._4_4_;
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar98._8_4_;
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar98._12_4_;
      bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar114._16_4_ = (uint)bVar14 * auVar89._16_4_ | (uint)!bVar14 * auVar98._16_4_;
      bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar114._20_4_ = (uint)bVar14 * auVar89._20_4_ | (uint)!bVar14 * auVar98._20_4_;
      bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar114._24_4_ = (uint)bVar14 * auVar89._24_4_ | (uint)!bVar14 * auVar98._24_4_;
      bVar14 = SUB81(uVar71 >> 7,0);
      auVar114._28_4_ = (uint)bVar14 * auVar89._28_4_ | (uint)!bVar14 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar89 = vblendmps_avx512vl(auVar98,local_500);
      auVar115._0_4_ =
           (uint)(bVar60 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar98._0_4_;
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar98._4_4_;
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar98._8_4_;
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar98._12_4_;
      bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar14 * auVar89._16_4_ | (uint)!bVar14 * auVar98._16_4_;
      bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar14 * auVar89._20_4_ | (uint)!bVar14 * auVar98._20_4_;
      bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar14 * auVar89._24_4_ | (uint)!bVar14 * auVar98._24_4_;
      bVar14 = SUB81(uVar71 >> 7,0);
      auVar115._28_4_ = (uint)bVar14 * auVar89._28_4_ | (uint)!bVar14 * auVar98._28_4_;
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar95,auVar98);
      local_520 = vmaxps_avx512vl(local_240,auVar98);
      auVar110._8_4_ = 0x36000000;
      auVar110._0_8_ = 0x3600000036000000;
      auVar110._12_4_ = 0x36000000;
      auVar110._16_4_ = 0x36000000;
      auVar110._20_4_ = 0x36000000;
      auVar110._24_4_ = 0x36000000;
      auVar110._28_4_ = 0x36000000;
      local_540 = vmulps_avx512vl(local_520,auVar110);
      vandps_avx512vl(auVar96,auVar98);
      uVar72 = vcmpps_avx512vl(local_540,local_540,1);
      uVar71 = uVar71 & uVar72;
      bVar62 = (byte)uVar71;
      if (bVar62 != 0) {
        uVar72 = vcmpps_avx512vl(auVar88,_DAT_01faff00,2);
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar96 = vblendmps_avx512vl(auVar88,auVar95);
        bVar65 = (byte)uVar72;
        uVar74 = (uint)(bVar65 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar65 & 1) * local_540._0_4_;
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        uVar73 = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * local_540._4_4_;
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        uVar126 = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * local_540._8_4_;
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        uVar127 = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * local_540._12_4_;
        bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
        uVar128 = (uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * local_540._16_4_;
        bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
        uVar129 = (uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * local_540._20_4_;
        bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
        uVar130 = (uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * local_540._24_4_;
        bVar14 = SUB81(uVar72 >> 7,0);
        uVar131 = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * local_540._28_4_;
        auVar114._0_4_ = (bVar62 & 1) * uVar74 | !(bool)(bVar62 & 1) * auVar114._0_4_;
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar114._4_4_ = bVar14 * uVar73 | !bVar14 * auVar114._4_4_;
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar114._8_4_ = bVar14 * uVar126 | !bVar14 * auVar114._8_4_;
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar114._12_4_ = bVar14 * uVar127 | !bVar14 * auVar114._12_4_;
        bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar114._16_4_ = bVar14 * uVar128 | !bVar14 * auVar114._16_4_;
        bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar114._20_4_ = bVar14 * uVar129 | !bVar14 * auVar114._20_4_;
        bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar114._24_4_ = bVar14 * uVar130 | !bVar14 * auVar114._24_4_;
        bVar14 = SUB81(uVar71 >> 7,0);
        auVar114._28_4_ = bVar14 * uVar131 | !bVar14 * auVar114._28_4_;
        auVar88 = vblendmps_avx512vl(auVar95,auVar88);
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar72 >> 3) & 1);
        bVar18 = (bool)((byte)(uVar72 >> 4) & 1);
        bVar19 = (bool)((byte)(uVar72 >> 5) & 1);
        bVar20 = (bool)((byte)(uVar72 >> 6) & 1);
        bVar21 = SUB81(uVar72 >> 7,0);
        auVar115._0_4_ =
             (uint)(bVar62 & 1) *
             ((uint)(bVar65 & 1) * auVar88._0_4_ | !(bool)(bVar65 & 1) * uVar74) |
             !(bool)(bVar62 & 1) * auVar115._0_4_;
        bVar15 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar115._4_4_ =
             (uint)bVar15 * ((uint)bVar14 * auVar88._4_4_ | !bVar14 * uVar73) |
             !bVar15 * auVar115._4_4_;
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar115._8_4_ =
             (uint)bVar14 * ((uint)bVar16 * auVar88._8_4_ | !bVar16 * uVar126) |
             !bVar14 * auVar115._8_4_;
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar115._12_4_ =
             (uint)bVar14 * ((uint)bVar17 * auVar88._12_4_ | !bVar17 * uVar127) |
             !bVar14 * auVar115._12_4_;
        bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar115._16_4_ =
             (uint)bVar14 * ((uint)bVar18 * auVar88._16_4_ | !bVar18 * uVar128) |
             !bVar14 * auVar115._16_4_;
        bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar115._20_4_ =
             (uint)bVar14 * ((uint)bVar19 * auVar88._20_4_ | !bVar19 * uVar129) |
             !bVar14 * auVar115._20_4_;
        bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar115._24_4_ =
             (uint)bVar14 * ((uint)bVar20 * auVar88._24_4_ | !bVar20 * uVar130) |
             !bVar14 * auVar115._24_4_;
        bVar14 = SUB81(uVar71 >> 7,0);
        auVar115._28_4_ =
             (uint)bVar14 * ((uint)bVar21 * auVar88._28_4_ | !bVar21 * uVar131) |
             !bVar14 * auVar115._28_4_;
        bVar60 = (~bVar62 | bVar65) & bVar60;
      }
      if ((bVar60 & 0x7f) == 0) goto LAB_01bd806e;
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar95 = vxorps_avx512vl(auVar107,auVar88);
      auVar96 = vxorps_avx512vl(auVar105,auVar88);
      uVar74 = *(uint *)(ray + k * 4 + 0x80);
      auVar98 = vxorps_avx512vl(auVar106,auVar88);
      auVar79 = vsubss_avx512f(ZEXT416(uVar74),ZEXT416((uint)local_660._0_4_));
      auVar89 = vbroadcastss_avx512vl(auVar79);
      auVar89 = vminps_avx512vl(auVar89,auVar115);
      auVar59._4_4_ = fStack_25c;
      auVar59._0_4_ = local_260;
      auVar59._8_4_ = fStack_258;
      auVar59._12_4_ = fStack_254;
      auVar59._16_4_ = fStack_250;
      auVar59._20_4_ = fStack_24c;
      auVar59._24_4_ = fStack_248;
      auVar59._28_4_ = fStack_244;
      auVar105 = vmaxps_avx512vl(auVar59,auVar114);
      auVar109 = vmulps_avx512vl(auVar109,auVar100);
      auVar108 = vfmadd213ps_avx512vl(auVar108,auVar146,auVar109);
      auVar79 = vfmadd213ps_fma(auVar97,auVar116,auVar108);
      auVar97 = vmulps_avx512vl(local_3c0,auVar100);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_3a0,auVar146);
      auVar78 = vfmadd231ps_fma(auVar97,_local_380,auVar116);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(ZEXT1632(auVar78),auVar97);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar22 = vcmpps_avx512vl(auVar97,auVar100,1);
      auVar108 = vxorps_avx512vl(ZEXT1632(auVar79),auVar88);
      auVar109 = vrcp14ps_avx512vl(ZEXT1632(auVar78));
      auVar146 = ZEXT1632(auVar78);
      auVar106 = vxorps_avx512vl(auVar146,auVar88);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar107 = vfnmadd213ps_avx512vl(auVar109,auVar146,auVar110);
      auVar79 = vfmadd132ps_fma(auVar107,auVar109,auVar109);
      fVar153 = auVar79._0_4_ * auVar108._0_4_;
      fVar172 = auVar79._4_4_ * auVar108._4_4_;
      auVar107._4_4_ = fVar172;
      auVar107._0_4_ = fVar153;
      fVar174 = auVar79._8_4_ * auVar108._8_4_;
      auVar107._8_4_ = fVar174;
      fVar176 = auVar79._12_4_ * auVar108._12_4_;
      auVar107._12_4_ = fVar176;
      fVar178 = auVar108._16_4_ * 0.0;
      auVar107._16_4_ = fVar178;
      fVar180 = auVar108._20_4_ * 0.0;
      auVar107._20_4_ = fVar180;
      fVar182 = auVar108._24_4_ * 0.0;
      auVar107._24_4_ = fVar182;
      auVar107._28_4_ = auVar108._28_4_;
      uVar23 = vcmpps_avx512vl(auVar146,auVar106,1);
      bVar62 = (byte)uVar22 | (byte)uVar23;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar107 = vblendmps_avx512vl(auVar107,auVar116);
      auVar117._0_4_ =
           (uint)(bVar62 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar109._0_4_;
      bVar14 = (bool)(bVar62 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar109._4_4_;
      bVar14 = (bool)(bVar62 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar109._8_4_;
      bVar14 = (bool)(bVar62 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar109._12_4_;
      bVar14 = (bool)(bVar62 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar14 * auVar107._16_4_ | (uint)!bVar14 * auVar109._16_4_;
      bVar14 = (bool)(bVar62 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar14 * auVar107._20_4_ | (uint)!bVar14 * auVar109._20_4_;
      bVar14 = (bool)(bVar62 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar14 * auVar107._24_4_ | (uint)!bVar14 * auVar109._24_4_;
      auVar117._28_4_ =
           (uint)(bVar62 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar109._28_4_;
      auVar109 = vmaxps_avx512vl(auVar105,auVar117);
      uVar23 = vcmpps_avx512vl(auVar146,auVar106,6);
      bVar62 = (byte)uVar22 | (byte)uVar23;
      auVar118._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * (int)fVar153;
      bVar14 = (bool)(bVar62 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar172;
      bVar14 = (bool)(bVar62 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar174;
      bVar14 = (bool)(bVar62 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar176;
      bVar14 = (bool)(bVar62 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar178;
      bVar14 = (bool)(bVar62 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar180;
      bVar14 = (bool)(bVar62 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar182;
      auVar118._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar108._28_4_;
      auVar108 = vminps_avx512vl(auVar89,auVar118);
      auVar79 = vxorps_avx512vl(auVar105._0_16_,auVar105._0_16_);
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar79),auVar102);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar79),auVar103);
      auVar105 = ZEXT1632(auVar79);
      auVar104 = vsubps_avx512vl(auVar105,auVar104);
      auVar104 = vmulps_avx512vl(auVar104,auVar95);
      auVar103 = vfmadd231ps_avx512vl(auVar104,auVar98,auVar103);
      auVar102 = vfmadd231ps_avx512vl(auVar103,auVar96,auVar102);
      auVar95 = vmulps_avx512vl(local_3c0,auVar95);
      auVar95 = vfmadd231ps_avx512vl(auVar95,local_3a0,auVar98);
      auVar95 = vfmadd231ps_avx512vl(auVar95,_local_380,auVar96);
      vandps_avx512vl(auVar95,auVar97);
      uVar22 = vcmpps_avx512vl(auVar95,auVar100,1);
      auVar96 = vxorps_avx512vl(auVar102,auVar88);
      auVar97 = vrcp14ps_avx512vl(auVar95);
      auVar88 = vxorps_avx512vl(auVar95,auVar88);
      auVar98 = vfnmadd213ps_avx512vl(auVar97,auVar95,auVar110);
      auVar79 = vfmadd132ps_fma(auVar98,auVar97,auVar97);
      fVar153 = auVar79._0_4_ * auVar96._0_4_;
      fVar172 = auVar79._4_4_ * auVar96._4_4_;
      auVar46._4_4_ = fVar172;
      auVar46._0_4_ = fVar153;
      fVar174 = auVar79._8_4_ * auVar96._8_4_;
      auVar46._8_4_ = fVar174;
      fVar176 = auVar79._12_4_ * auVar96._12_4_;
      auVar46._12_4_ = fVar176;
      fVar178 = auVar96._16_4_ * 0.0;
      auVar46._16_4_ = fVar178;
      fVar180 = auVar96._20_4_ * 0.0;
      auVar46._20_4_ = fVar180;
      fVar182 = auVar96._24_4_ * 0.0;
      auVar46._24_4_ = fVar182;
      auVar46._28_4_ = auVar96._28_4_;
      uVar23 = vcmpps_avx512vl(auVar95,auVar88,1);
      bVar62 = (byte)uVar22 | (byte)uVar23;
      auVar98 = vblendmps_avx512vl(auVar46,auVar116);
      auVar119._0_4_ =
           (uint)(bVar62 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar97._0_4_;
      bVar14 = (bool)(bVar62 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar97._4_4_;
      bVar14 = (bool)(bVar62 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar97._8_4_;
      bVar14 = (bool)(bVar62 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar97._12_4_;
      bVar14 = (bool)(bVar62 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * auVar97._16_4_;
      bVar14 = (bool)(bVar62 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * auVar97._20_4_;
      bVar14 = (bool)(bVar62 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * auVar97._24_4_;
      auVar119._28_4_ =
           (uint)(bVar62 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar97._28_4_;
      _local_600 = vmaxps_avx(auVar109,auVar119);
      uVar23 = vcmpps_avx512vl(auVar95,auVar88,6);
      bVar62 = (byte)uVar22 | (byte)uVar23;
      auVar120._0_4_ = (uint)(bVar62 & 1) * 0x7f800000 | (uint)!(bool)(bVar62 & 1) * (int)fVar153;
      bVar14 = (bool)(bVar62 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar172;
      bVar14 = (bool)(bVar62 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar174;
      bVar14 = (bool)(bVar62 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar176;
      bVar14 = (bool)(bVar62 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar178;
      bVar14 = (bool)(bVar62 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar180;
      bVar14 = (bool)(bVar62 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar182;
      auVar120._28_4_ =
           (uint)(bVar62 >> 7) * 0x7f800000 | (uint)!(bool)(bVar62 >> 7) * auVar96._28_4_;
      local_2c0 = vminps_avx(auVar108,auVar120);
      uVar22 = vcmpps_avx512vl(_local_600,local_2c0,2);
      bVar60 = bVar60 & 0x7f & (byte)uVar22;
      if (bVar60 == 0) {
        auVar274 = ZEXT3264(local_740);
        goto LAB_01bd806e;
      }
      auVar95 = vmaxps_avx512vl(auVar105,local_760);
      auVar88 = vfmadd213ps_avx512vl(local_4e0,auVar111,auVar94);
      fVar153 = auVar90._0_4_;
      fVar172 = auVar90._4_4_;
      auVar47._4_4_ = fVar172 * auVar88._4_4_;
      auVar47._0_4_ = fVar153 * auVar88._0_4_;
      fVar174 = auVar90._8_4_;
      auVar47._8_4_ = fVar174 * auVar88._8_4_;
      fVar176 = auVar90._12_4_;
      auVar47._12_4_ = fVar176 * auVar88._12_4_;
      fVar178 = auVar90._16_4_;
      auVar47._16_4_ = fVar178 * auVar88._16_4_;
      fVar180 = auVar90._20_4_;
      auVar47._20_4_ = fVar180 * auVar88._20_4_;
      fVar182 = auVar90._24_4_;
      auVar47._24_4_ = fVar182 * auVar88._24_4_;
      auVar47._28_4_ = auVar88._28_4_;
      auVar88 = vfmadd213ps_avx512vl(local_500,auVar111,auVar94);
      auVar48._4_4_ = fVar172 * auVar88._4_4_;
      auVar48._0_4_ = fVar153 * auVar88._0_4_;
      auVar48._8_4_ = fVar174 * auVar88._8_4_;
      auVar48._12_4_ = fVar176 * auVar88._12_4_;
      auVar48._16_4_ = fVar178 * auVar88._16_4_;
      auVar48._20_4_ = fVar180 * auVar88._20_4_;
      auVar48._24_4_ = fVar182 * auVar88._24_4_;
      auVar48._28_4_ = auVar119._28_4_;
      auVar88 = vminps_avx512vl(auVar47,auVar110);
      auVar56 = ZEXT812(0);
      auVar96 = ZEXT1232(auVar56) << 0x20;
      auVar88 = vmaxps_avx(auVar88,ZEXT1232(auVar56) << 0x20);
      auVar97 = vminps_avx512vl(auVar48,auVar110);
      auVar49._4_4_ = (auVar88._4_4_ + 1.0) * 0.125;
      auVar49._0_4_ = (auVar88._0_4_ + 0.0) * 0.125;
      auVar49._8_4_ = (auVar88._8_4_ + 2.0) * 0.125;
      auVar49._12_4_ = (auVar88._12_4_ + 3.0) * 0.125;
      auVar49._16_4_ = (auVar88._16_4_ + 4.0) * 0.125;
      auVar49._20_4_ = (auVar88._20_4_ + 5.0) * 0.125;
      auVar49._24_4_ = (auVar88._24_4_ + 6.0) * 0.125;
      auVar49._28_4_ = auVar88._28_4_ + 7.0;
      auVar79 = vfmadd213ps_fma(auVar49,local_7a0,auVar217);
      local_1a0 = ZEXT1632(auVar79);
      auVar88 = vmaxps_avx(auVar97,ZEXT1232(auVar56) << 0x20);
      auVar50._4_4_ = (auVar88._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar88._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar88._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar88._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar88._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar88._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar88._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar88._28_4_ + 7.0;
      auVar79 = vfmadd213ps_fma(auVar50,local_7a0,auVar217);
      local_1c0 = ZEXT1632(auVar79);
      auVar51._4_4_ = auVar95._4_4_ * auVar95._4_4_;
      auVar51._0_4_ = auVar95._0_4_ * auVar95._0_4_;
      auVar51._8_4_ = auVar95._8_4_ * auVar95._8_4_;
      auVar51._12_4_ = auVar95._12_4_ * auVar95._12_4_;
      auVar51._16_4_ = auVar95._16_4_ * auVar95._16_4_;
      auVar51._20_4_ = auVar95._20_4_ * auVar95._20_4_;
      auVar51._24_4_ = auVar95._24_4_ * auVar95._24_4_;
      auVar51._28_4_ = auVar95._28_4_;
      auVar88 = vsubps_avx(local_780,auVar51);
      auVar52._4_4_ = auVar88._4_4_ * (float)local_4c0._4_4_;
      auVar52._0_4_ = auVar88._0_4_ * (float)local_4c0._0_4_;
      auVar52._8_4_ = auVar88._8_4_ * fStack_4b8;
      auVar52._12_4_ = auVar88._12_4_ * fStack_4b4;
      auVar52._16_4_ = auVar88._16_4_ * fStack_4b0;
      auVar52._20_4_ = auVar88._20_4_ * fStack_4ac;
      auVar52._24_4_ = auVar88._24_4_ * fStack_4a8;
      auVar52._28_4_ = auVar95._28_4_;
      auVar95 = vsubps_avx(local_680,auVar52);
      uVar71 = vcmpps_avx512vl(auVar95,ZEXT1232(auVar56) << 0x20,5);
      auVar274 = ZEXT3264(local_740);
      if ((byte)uVar71 == 0) {
        uVar71 = 0;
        auVar90 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar228 = ZEXT864(0) << 0x20;
        auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar97 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar252 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar111._8_4_ = 0x7f800000;
        auVar111._0_8_ = 0x7f8000007f800000;
        auVar111._12_4_ = 0x7f800000;
        auVar111._16_4_ = 0x7f800000;
        auVar111._20_4_ = 0x7f800000;
        auVar111._24_4_ = 0x7f800000;
        auVar111._28_4_ = 0x7f800000;
        auVar112._8_4_ = 0xff800000;
        auVar112._0_8_ = 0xff800000ff800000;
        auVar112._12_4_ = 0xff800000;
        auVar112._16_4_ = 0xff800000;
        auVar112._20_4_ = 0xff800000;
        auVar112._24_4_ = 0xff800000;
        auVar112._28_4_ = 0xff800000;
      }
      else {
        auVar78 = vxorps_avx512vl(auVar89._0_16_,auVar89._0_16_);
        uVar72 = vcmpps_avx512vl(auVar95,auVar105,5);
        auVar95 = vsqrtps_avx(auVar95);
        auVar96 = vfnmadd213ps_avx512vl(auVar113,local_6a0,auVar110);
        auVar98 = vfmadd132ps_avx512vl(auVar96,local_6a0,local_6a0);
        auVar96 = vsubps_avx(local_720,auVar95);
        auVar102 = vmulps_avx512vl(auVar96,auVar98);
        auVar95 = vsubps_avx512vl(auVar95,auVar112);
        auVar98 = vmulps_avx512vl(auVar95,auVar98);
        auVar95 = vfmadd213ps_avx512vl(auVar111,auVar102,auVar94);
        auVar113._4_4_ = fVar172 * auVar95._4_4_;
        auVar113._0_4_ = fVar153 * auVar95._0_4_;
        auVar113._8_4_ = fVar174 * auVar95._8_4_;
        auVar113._12_4_ = fVar176 * auVar95._12_4_;
        auVar113._16_4_ = fVar178 * auVar95._16_4_;
        auVar113._20_4_ = fVar180 * auVar95._20_4_;
        auVar113._24_4_ = fVar182 * auVar95._24_4_;
        auVar113._28_4_ = auVar97._28_4_;
        auVar53._4_4_ = (float)local_380._4_4_ * auVar102._4_4_;
        auVar53._0_4_ = (float)local_380._0_4_ * auVar102._0_4_;
        auVar53._8_4_ = fStack_378 * auVar102._8_4_;
        auVar53._12_4_ = fStack_374 * auVar102._12_4_;
        auVar53._16_4_ = fStack_370 * auVar102._16_4_;
        auVar53._20_4_ = fStack_36c * auVar102._20_4_;
        auVar53._24_4_ = fStack_368 * auVar102._24_4_;
        auVar53._28_4_ = auVar95._28_4_;
        auVar96 = vmulps_avx512vl(local_3a0,auVar102);
        auVar103 = vmulps_avx512vl(local_3c0,auVar102);
        auVar95 = vfmadd213ps_avx512vl(auVar91,auVar113,auVar227);
        auVar95 = vsubps_avx512vl(auVar53,auVar95);
        auVar97 = vfmadd213ps_avx512vl(auVar92,auVar113,auVar99);
        auVar97 = vsubps_avx512vl(auVar96,auVar97);
        auVar79 = vfmadd213ps_fma(auVar113,auVar93,auVar101);
        auVar96 = vsubps_avx(auVar103,ZEXT1632(auVar79));
        auVar252 = auVar96._0_28_;
        auVar94 = vfmadd213ps_avx512vl(auVar111,auVar98,auVar94);
        auVar94 = vmulps_avx512vl(auVar90,auVar94);
        auVar262 = ZEXT3264(auVar94);
        auVar54._4_4_ = (float)local_380._4_4_ * auVar98._4_4_;
        auVar54._0_4_ = (float)local_380._0_4_ * auVar98._0_4_;
        auVar54._8_4_ = fStack_378 * auVar98._8_4_;
        auVar54._12_4_ = fStack_374 * auVar98._12_4_;
        auVar54._16_4_ = fStack_370 * auVar98._16_4_;
        auVar54._20_4_ = fStack_36c * auVar98._20_4_;
        auVar54._24_4_ = fStack_368 * auVar98._24_4_;
        auVar54._28_4_ = auVar103._28_4_;
        auVar90 = vmulps_avx512vl(local_3a0,auVar98);
        auVar103 = vmulps_avx512vl(local_3c0,auVar98);
        auVar79 = vfmadd213ps_fma(auVar91,auVar94,auVar227);
        auVar96 = vsubps_avx(auVar54,ZEXT1632(auVar79));
        auVar79 = vfmadd213ps_fma(auVar92,auVar94,auVar99);
        auVar90 = vsubps_avx512vl(auVar90,ZEXT1632(auVar79));
        auVar79 = vfmadd213ps_fma(auVar93,auVar94,auVar101);
        auVar91 = vsubps_avx512vl(auVar103,ZEXT1632(auVar79));
        auVar228 = ZEXT3264(auVar91);
        auVar206._8_4_ = 0x7f800000;
        auVar206._0_8_ = 0x7f8000007f800000;
        auVar206._12_4_ = 0x7f800000;
        auVar206._16_4_ = 0x7f800000;
        auVar206._20_4_ = 0x7f800000;
        auVar206._24_4_ = 0x7f800000;
        auVar206._28_4_ = 0x7f800000;
        auVar91 = vblendmps_avx512vl(auVar206,auVar102);
        bVar14 = (bool)((byte)uVar72 & 1);
        auVar111._0_4_ = (uint)bVar14 * auVar91._0_4_ | (uint)!bVar14 * auVar83._0_4_;
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar83._4_4_;
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar83._8_4_;
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar83._12_4_;
        iVar1 = (uint)((byte)(uVar72 >> 4) & 1) * auVar91._16_4_;
        auVar111._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar72 >> 5) & 1) * auVar91._20_4_;
        auVar111._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar72 >> 6) & 1) * auVar91._24_4_;
        auVar111._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar72 >> 7) * auVar91._28_4_;
        auVar111._28_4_ = iVar4;
        auVar207._8_4_ = 0xff800000;
        auVar207._0_8_ = 0xff800000ff800000;
        auVar207._12_4_ = 0xff800000;
        auVar207._16_4_ = 0xff800000;
        auVar207._20_4_ = 0xff800000;
        auVar207._24_4_ = 0xff800000;
        auVar207._28_4_ = 0xff800000;
        auVar91 = vblendmps_avx512vl(auVar207,auVar98);
        bVar14 = (bool)((byte)uVar72 & 1);
        auVar112._0_4_ = (uint)bVar14 * auVar91._0_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar112._16_4_ = (uint)bVar14 * auVar91._16_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar112._20_4_ = (uint)bVar14 * auVar91._20_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar112._24_4_ = (uint)bVar14 * auVar91._24_4_ | (uint)!bVar14 * -0x800000;
        bVar14 = SUB81(uVar72 >> 7,0);
        auVar112._28_4_ = (uint)bVar14 * auVar91._28_4_ | (uint)!bVar14 * -0x800000;
        auVar227._8_4_ = 0x36000000;
        auVar227._0_8_ = 0x3600000036000000;
        auVar227._12_4_ = 0x36000000;
        auVar227._16_4_ = 0x36000000;
        auVar227._20_4_ = 0x36000000;
        auVar227._24_4_ = 0x36000000;
        auVar227._28_4_ = 0x36000000;
        auVar91 = vmulps_avx512vl(local_520,auVar227);
        uVar24 = vcmpps_avx512vl(auVar91,local_540,0xe);
        uVar72 = uVar72 & uVar24;
        bVar62 = (byte)uVar72;
        if (bVar62 != 0) {
          uVar24 = vcmpps_avx512vl(auVar88,ZEXT1632(auVar78),2);
          auVar248._8_4_ = 0x7f800000;
          auVar248._0_8_ = 0x7f8000007f800000;
          auVar248._12_4_ = 0x7f800000;
          auVar248._16_4_ = 0x7f800000;
          auVar248._20_4_ = 0x7f800000;
          auVar248._24_4_ = 0x7f800000;
          auVar248._28_4_ = 0x7f800000;
          auVar258._8_4_ = 0xff800000;
          auVar258._0_8_ = 0xff800000ff800000;
          auVar258._12_4_ = 0xff800000;
          auVar258._16_4_ = 0xff800000;
          auVar258._20_4_ = 0xff800000;
          auVar258._24_4_ = 0xff800000;
          auVar258._28_4_ = 0xff800000;
          auVar88 = vblendmps_avx512vl(auVar248,auVar258);
          bVar65 = (byte)uVar24;
          uVar73 = (uint)(bVar65 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar91._0_4_;
          bVar14 = (bool)((byte)(uVar24 >> 1) & 1);
          uVar126 = (uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * auVar91._4_4_;
          bVar14 = (bool)((byte)(uVar24 >> 2) & 1);
          uVar127 = (uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * auVar91._8_4_;
          bVar14 = (bool)((byte)(uVar24 >> 3) & 1);
          uVar128 = (uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * auVar91._12_4_;
          bVar14 = (bool)((byte)(uVar24 >> 4) & 1);
          uVar129 = (uint)bVar14 * auVar88._16_4_ | (uint)!bVar14 * auVar91._16_4_;
          bVar14 = (bool)((byte)(uVar24 >> 5) & 1);
          uVar130 = (uint)bVar14 * auVar88._20_4_ | (uint)!bVar14 * auVar91._20_4_;
          bVar14 = (bool)((byte)(uVar24 >> 6) & 1);
          uVar131 = (uint)bVar14 * auVar88._24_4_ | (uint)!bVar14 * auVar91._24_4_;
          bVar14 = SUB81(uVar24 >> 7,0);
          uVar132 = (uint)bVar14 * auVar88._28_4_ | (uint)!bVar14 * auVar91._28_4_;
          auVar111._0_4_ = (bVar62 & 1) * uVar73 | !(bool)(bVar62 & 1) * auVar111._0_4_;
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar111._4_4_ = bVar14 * uVar126 | !bVar14 * auVar111._4_4_;
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar111._8_4_ = bVar14 * uVar127 | !bVar14 * auVar111._8_4_;
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar111._12_4_ = bVar14 * uVar128 | !bVar14 * auVar111._12_4_;
          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar111._16_4_ = bVar14 * uVar129 | (uint)!bVar14 * iVar1;
          bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar111._20_4_ = bVar14 * uVar130 | (uint)!bVar14 * iVar2;
          bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar111._24_4_ = bVar14 * uVar131 | (uint)!bVar14 * iVar3;
          bVar14 = SUB81(uVar72 >> 7,0);
          auVar111._28_4_ = bVar14 * uVar132 | (uint)!bVar14 * iVar4;
          auVar88 = vblendmps_avx512vl(auVar258,auVar248);
          bVar14 = (bool)((byte)(uVar24 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar24 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar24 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar24 >> 4) & 1);
          bVar19 = (bool)((byte)(uVar24 >> 5) & 1);
          bVar20 = (bool)((byte)(uVar24 >> 6) & 1);
          bVar21 = SUB81(uVar24 >> 7,0);
          auVar112._0_4_ =
               (uint)(bVar62 & 1) *
               ((uint)(bVar65 & 1) * auVar88._0_4_ | !(bool)(bVar65 & 1) * uVar73) |
               !(bool)(bVar62 & 1) * auVar112._0_4_;
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar112._4_4_ =
               (uint)bVar15 * ((uint)bVar14 * auVar88._4_4_ | !bVar14 * uVar126) |
               !bVar15 * auVar112._4_4_;
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar112._8_4_ =
               (uint)bVar14 * ((uint)bVar16 * auVar88._8_4_ | !bVar16 * uVar127) |
               !bVar14 * auVar112._8_4_;
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar112._12_4_ =
               (uint)bVar14 * ((uint)bVar17 * auVar88._12_4_ | !bVar17 * uVar128) |
               !bVar14 * auVar112._12_4_;
          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar112._16_4_ =
               (uint)bVar14 * ((uint)bVar18 * auVar88._16_4_ | !bVar18 * uVar129) |
               !bVar14 * auVar112._16_4_;
          bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar112._20_4_ =
               (uint)bVar14 * ((uint)bVar19 * auVar88._20_4_ | !bVar19 * uVar130) |
               !bVar14 * auVar112._20_4_;
          bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar112._24_4_ =
               (uint)bVar14 * ((uint)bVar20 * auVar88._24_4_ | !bVar20 * uVar131) |
               !bVar14 * auVar112._24_4_;
          bVar14 = SUB81(uVar72 >> 7,0);
          auVar112._28_4_ =
               (uint)bVar14 * ((uint)bVar21 * auVar88._28_4_ | !bVar21 * uVar132) |
               !bVar14 * auVar112._28_4_;
          uVar71 = (ulong)(byte)((~bVar62 | bVar65) & (byte)uVar71);
        }
      }
      auVar271 = ZEXT3264(local_8c0);
      auVar263 = ZEXT3264(local_8e0);
      auVar264 = ZEXT3264(local_900);
      auVar265 = ZEXT3264(local_920);
      auVar267 = ZEXT3264(local_940);
      auVar269 = ZEXT3264(local_960);
      auVar270 = ZEXT3264(local_980);
      auVar245._0_4_ = local_3c0._0_4_ * auVar228._0_4_;
      auVar245._4_4_ = local_3c0._4_4_ * auVar228._4_4_;
      auVar245._8_4_ = local_3c0._8_4_ * auVar228._8_4_;
      auVar245._12_4_ = local_3c0._12_4_ * auVar228._12_4_;
      auVar245._16_4_ = local_3c0._16_4_ * auVar228._16_4_;
      auVar245._20_4_ = local_3c0._20_4_ * auVar228._20_4_;
      auVar245._28_36_ = auVar228._28_36_;
      auVar245._24_4_ = local_3c0._24_4_ * auVar228._24_4_;
      auVar79 = vfmadd231ps_fma(auVar245._0_32_,local_3a0,auVar90);
      auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),_local_380,auVar96);
      _local_200 = _local_600;
      local_1e0 = vminps_avx(local_2c0,auVar111);
      auVar244._8_4_ = 0x7fffffff;
      auVar244._0_8_ = 0x7fffffff7fffffff;
      auVar244._12_4_ = 0x7fffffff;
      auVar244._16_4_ = 0x7fffffff;
      auVar244._20_4_ = 0x7fffffff;
      auVar244._24_4_ = 0x7fffffff;
      auVar244._28_4_ = 0x7fffffff;
      auVar88 = vandps_avx(ZEXT1632(auVar79),auVar244);
      auVar90 = vmaxps_avx(_local_600,auVar112);
      local_2e0 = auVar90;
      auVar209._8_4_ = 0x3e99999a;
      auVar209._0_8_ = 0x3e99999a3e99999a;
      auVar209._12_4_ = 0x3e99999a;
      auVar209._16_4_ = 0x3e99999a;
      auVar209._20_4_ = 0x3e99999a;
      auVar209._24_4_ = 0x3e99999a;
      auVar209._28_4_ = 0x3e99999a;
      uVar22 = vcmpps_avx512vl(auVar88,auVar209,1);
      local_360._0_2_ = (short)uVar22;
      uVar22 = vcmpps_avx512vl(_local_600,local_1e0,2);
      bVar62 = (byte)uVar22 & bVar60;
      uVar23 = vcmpps_avx512vl(auVar90,local_2c0,2);
      auVar273 = ZEXT3264(local_7c0);
      auVar266 = ZEXT3264(local_7e0);
      auVar268 = ZEXT3264(local_800);
      if ((bVar60 & ((byte)uVar23 | (byte)uVar22)) == 0) {
        auVar250 = ZEXT3264(local_880);
        auVar251 = ZEXT3264(local_860);
        auVar259 = ZEXT3264(local_8a0);
        auVar245 = ZEXT3264(local_560);
        auVar228 = ZEXT3264(local_6e0);
      }
      else {
        uVar72 = CONCAT71((int7)(uVar71 >> 8),~(byte)uVar71);
        auVar55._4_4_ = local_3c0._4_4_ * auVar252._4_4_;
        auVar55._0_4_ = local_3c0._0_4_ * auVar252._0_4_;
        auVar55._8_4_ = local_3c0._8_4_ * auVar252._8_4_;
        auVar55._12_4_ = local_3c0._12_4_ * auVar252._12_4_;
        auVar55._16_4_ = local_3c0._16_4_ * auVar252._16_4_;
        auVar55._20_4_ = local_3c0._20_4_ * auVar252._20_4_;
        auVar55._24_4_ = local_3c0._24_4_ * auVar252._24_4_;
        auVar55._28_4_ = 0x3e99999a;
        auVar79 = vfmadd213ps_fma(auVar97,local_3a0,auVar55);
        auVar79 = vfmadd213ps_fma(auVar95,_local_380,ZEXT1632(auVar79));
        auVar88 = vandps_avx(ZEXT1632(auVar79),auVar244);
        uVar22 = vcmpps_avx512vl(auVar88,auVar209,1);
        bVar65 = (byte)uVar22 | ~(byte)uVar71;
        auVar148._8_4_ = 2;
        auVar148._0_8_ = 0x200000002;
        auVar148._12_4_ = 2;
        auVar148._16_4_ = 2;
        auVar148._20_4_ = 2;
        auVar148._24_4_ = 2;
        auVar148._28_4_ = 2;
        auVar43._8_4_ = 3;
        auVar43._0_8_ = 0x300000003;
        auVar43._12_4_ = 3;
        auVar43._16_4_ = 3;
        auVar43._20_4_ = 3;
        auVar43._24_4_ = 3;
        auVar43._28_4_ = 3;
        auVar88 = vpblendmd_avx512vl(auVar148,auVar43);
        local_280._0_4_ = (uint)(bVar65 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar65 & 1) * 2;
        bVar14 = (bool)(bVar65 >> 1 & 1);
        local_280._4_4_ = (uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 2 & 1);
        local_280._8_4_ = (uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 3 & 1);
        local_280._12_4_ = (uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 4 & 1);
        local_280._16_4_ = (uint)bVar14 * auVar88._16_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 5 & 1);
        local_280._20_4_ = (uint)bVar14 * auVar88._20_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 6 & 1);
        local_280._24_4_ = (uint)bVar14 * auVar88._24_4_ | (uint)!bVar14 * 2;
        local_280._28_4_ = (uint)(bVar65 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar65 >> 7) * 2;
        local_300 = vpbroadcastd_avx512vl();
        uVar22 = vpcmpd_avx512vl(local_300,local_280,5);
        bVar65 = (byte)uVar22 & bVar62;
        auVar251 = ZEXT3264(local_860);
        if (bVar65 == 0) {
          auVar150._4_4_ = uVar74;
          auVar150._0_4_ = uVar74;
          auVar150._8_4_ = uVar74;
          auVar150._12_4_ = uVar74;
          auVar150._16_4_ = uVar74;
          auVar150._20_4_ = uVar74;
          auVar150._24_4_ = uVar74;
          auVar150._28_4_ = uVar74;
          auVar250 = ZEXT3264(local_880);
          auVar259 = ZEXT3264(local_8a0);
        }
        else {
          local_2a0 = auVar90;
          local_98c = (uint)uVar72;
          auVar78 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar79 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar81 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar86 = vminps_avx(auVar78,auVar81);
          auVar78 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar81 = vmaxps_avx(auVar79,auVar78);
          auVar186._8_4_ = 0x7fffffff;
          auVar186._0_8_ = 0x7fffffff7fffffff;
          auVar186._12_4_ = 0x7fffffff;
          auVar79 = vandps_avx(auVar86,auVar186);
          auVar78 = vandps_avx(auVar81,auVar186);
          auVar79 = vmaxps_avx(auVar79,auVar78);
          auVar78 = vmovshdup_avx(auVar79);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          auVar79 = vshufpd_avx(auVar79,auVar79,1);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          fVar152 = auVar79._0_4_ * 1.9073486e-06;
          local_650 = vshufps_avx(auVar81,auVar81,0xff);
          local_340 = (float)local_6c0._0_4_ + (float)local_600._0_4_;
          fStack_33c = (float)local_6c0._4_4_ + (float)local_600._4_4_;
          fStack_338 = fStack_6b8 + fStack_5f8;
          fStack_334 = fStack_6b4 + fStack_5f4;
          fStack_330 = fStack_6b0 + fStack_5f0;
          fStack_32c = fStack_6ac + fStack_5ec;
          fStack_328 = fStack_6a8 + fStack_5e8;
          fStack_324 = fStack_6a4 + fStack_5e4;
          do {
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar88 = vblendmps_avx512vl(auVar149,_local_600);
            auVar122._0_4_ =
                 (uint)(bVar65 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 1 & 1);
            auVar122._4_4_ = (uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 2 & 1);
            auVar122._8_4_ = (uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 3 & 1);
            auVar122._12_4_ = (uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 4 & 1);
            auVar122._16_4_ = (uint)bVar14 * auVar88._16_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 5 & 1);
            auVar122._20_4_ = (uint)bVar14 * auVar88._20_4_ | (uint)!bVar14 * 0x7f800000;
            auVar122._24_4_ =
                 (uint)(bVar65 >> 6) * auVar88._24_4_ | (uint)!(bool)(bVar65 >> 6) * 0x7f800000;
            auVar122._28_4_ = 0x7f800000;
            auVar88 = vshufps_avx(auVar122,auVar122,0xb1);
            auVar88 = vminps_avx(auVar122,auVar88);
            auVar90 = vshufpd_avx(auVar88,auVar88,5);
            auVar88 = vminps_avx(auVar88,auVar90);
            auVar90 = vpermpd_avx2(auVar88,0x4e);
            auVar88 = vminps_avx(auVar88,auVar90);
            uVar22 = vcmpps_avx512vl(auVar122,auVar88,0);
            bVar61 = (byte)uVar22 & bVar65;
            bVar70 = bVar65;
            if (bVar61 != 0) {
              bVar70 = bVar61;
            }
            iVar2 = 0;
            for (uVar74 = (uint)bVar70; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            fVar175 = local_988;
            fVar173 = *(float *)(local_1a0 + (uint)(iVar2 << 2));
            uVar154 = 0;
            uVar253 = 0;
            uVar254 = 0;
            fVar171 = *(float *)(local_200 + (uint)(iVar2 << 2));
            uVar255 = 0;
            uVar256 = 0;
            uVar257 = 0;
            if ((float)local_700._0_4_ < 0.0) {
              local_760._0_16_ = ZEXT416((uint)*(float *)(local_1a0 + (uint)(iVar2 << 2)));
              local_780._0_16_ = ZEXT416((uint)*(float *)(local_200 + (uint)(iVar2 << 2)));
              fVar175 = sqrtf((float)local_700._0_4_);
              fVar173 = (float)local_760._0_4_;
              uVar154 = local_760._4_4_;
              uVar253 = local_760._8_4_;
              uVar254 = local_760._12_4_;
              fVar171 = (float)local_780._0_4_;
              uVar255 = local_780._4_4_;
              uVar256 = local_780._8_4_;
              uVar257 = local_780._12_4_;
            }
            lVar67 = 5;
            do {
              auVar90 = local_760;
              auVar88 = local_780;
              auVar139._4_4_ = fVar171;
              auVar139._0_4_ = fVar171;
              auVar139._8_4_ = fVar171;
              auVar139._12_4_ = fVar171;
              auVar78 = vfmadd132ps_fma(auVar139,ZEXT816(0) << 0x40,local_6f0);
              fVar134 = 1.0 - fVar173;
              auVar187._0_4_ = local_5c0._0_4_ * fVar173;
              auVar187._4_4_ = local_5c0._4_4_ * fVar173;
              auVar187._8_4_ = local_5c0._8_4_ * fVar173;
              auVar187._12_4_ = local_5c0._12_4_ * fVar173;
              local_4e0._0_16_ = ZEXT416((uint)fVar134);
              auVar215._4_4_ = fVar134;
              auVar215._0_4_ = fVar134;
              auVar215._8_4_ = fVar134;
              auVar215._12_4_ = fVar134;
              auVar79 = vfmadd231ps_fma(auVar187,auVar215,local_580._0_16_);
              auVar221._0_4_ = local_5a0._0_4_ * fVar173;
              auVar221._4_4_ = local_5a0._4_4_ * fVar173;
              auVar221._8_4_ = local_5a0._8_4_ * fVar173;
              auVar221._12_4_ = local_5a0._12_4_ * fVar173;
              auVar81 = vfmadd231ps_fma(auVar221,auVar215,local_5c0._0_16_);
              auVar234._0_4_ = fVar173 * (float)local_5e0._0_4_;
              auVar234._4_4_ = fVar173 * (float)local_5e0._4_4_;
              auVar234._8_4_ = fVar173 * fStack_5d8;
              auVar234._12_4_ = fVar173 * fStack_5d4;
              auVar86 = vfmadd231ps_fma(auVar234,auVar215,local_5a0._0_16_);
              auVar241._0_4_ = fVar173 * auVar81._0_4_;
              auVar241._4_4_ = fVar173 * auVar81._4_4_;
              auVar241._8_4_ = fVar173 * auVar81._8_4_;
              auVar241._12_4_ = fVar173 * auVar81._12_4_;
              auVar79 = vfmadd231ps_fma(auVar241,auVar215,auVar79);
              auVar188._0_4_ = fVar173 * auVar86._0_4_;
              auVar188._4_4_ = fVar173 * auVar86._4_4_;
              auVar188._8_4_ = fVar173 * auVar86._8_4_;
              auVar188._12_4_ = fVar173 * auVar86._12_4_;
              auVar81 = vfmadd231ps_fma(auVar188,auVar215,auVar81);
              auVar222._0_4_ = fVar173 * auVar81._0_4_;
              auVar222._4_4_ = fVar173 * auVar81._4_4_;
              auVar222._8_4_ = fVar173 * auVar81._8_4_;
              auVar222._12_4_ = fVar173 * auVar81._12_4_;
              auVar86 = vfmadd231ps_fma(auVar222,auVar79,auVar215);
              auVar79 = vsubps_avx(auVar81,auVar79);
              auVar32._8_4_ = 0x40400000;
              auVar32._0_8_ = 0x4040000040400000;
              auVar32._12_4_ = 0x40400000;
              auVar81 = vmulps_avx512vl(auVar79,auVar32);
              _local_4c0 = auVar86;
              auVar78 = vsubps_avx(auVar78,auVar86);
              auVar79 = vdpps_avx(auVar78,auVar78,0x7f);
              local_7a0._0_16_ = auVar81;
              local_680._0_16_ = auVar79;
              local_760._4_4_ = uVar154;
              local_760._0_4_ = fVar173;
              local_760._8_4_ = uVar253;
              local_760._16_16_ = auVar90._16_16_;
              local_760._12_4_ = uVar254;
              local_780._4_4_ = uVar255;
              local_780._0_4_ = fVar171;
              local_780._8_4_ = uVar256;
              local_780._16_16_ = auVar88._16_16_;
              local_780._12_4_ = uVar257;
              if (auVar79._0_4_ < 0.0) {
                auVar228._0_4_ = sqrtf(auVar79._0_4_);
                auVar228._4_60_ = extraout_var;
                auVar79 = auVar228._0_16_;
                auVar81 = local_7a0._0_16_;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
              }
              local_500._0_16_ = vdpps_avx(auVar81,auVar81,0x7f);
              fVar171 = local_500._0_4_;
              auVar189._4_12_ = ZEXT812(0) << 0x20;
              auVar189._0_4_ = fVar171;
              local_720._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
              fVar173 = local_720._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
              auVar33._8_4_ = 0x80000000;
              auVar33._0_8_ = 0x8000000080000000;
              auVar33._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(local_500._0_16_,auVar33);
              auVar86 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar86._0_4_;
              local_6a0._0_4_ = auVar79._0_4_;
              if (fVar171 < auVar82._0_4_) {
                fVar134 = sqrtf(fVar171);
                auVar79 = ZEXT416((uint)local_6a0._0_4_);
                auVar81 = local_7a0._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx(local_500._0_16_,local_500._0_16_);
                fVar134 = auVar86._0_4_;
              }
              fVar177 = local_720._0_4_;
              fVar171 = fVar173 * 1.5 + fVar171 * -0.5 * fVar177 * fVar177 * fVar177;
              auVar140._0_4_ = auVar81._0_4_ * fVar171;
              auVar140._4_4_ = auVar81._4_4_ * fVar171;
              auVar140._8_4_ = auVar81._8_4_ * fVar171;
              auVar140._12_4_ = auVar81._12_4_ * fVar171;
              local_720._0_16_ = vdpps_avx(auVar140,auVar78,0x7f);
              auVar83 = vaddss_avx512f(auVar79,ZEXT416(0x3f800000));
              auVar141._0_4_ = local_720._0_4_ * local_720._0_4_;
              auVar141._4_4_ = local_720._4_4_ * local_720._4_4_;
              auVar141._8_4_ = local_720._8_4_ * local_720._8_4_;
              auVar141._12_4_ = local_720._12_4_ * local_720._12_4_;
              auVar86 = vsubps_avx(local_680._0_16_,auVar141);
              fVar173 = auVar86._0_4_;
              auVar159._4_12_ = ZEXT812(0) << 0x20;
              auVar159._0_4_ = fVar173;
              auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar159);
              auVar84 = vmulss_avx512f(auVar82,ZEXT416(0x3fc00000));
              auVar80 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
              uVar69 = fVar173 == 0.0;
              uVar68 = fVar173 < 0.0;
              if ((bool)uVar68) {
                local_620._0_4_ = auVar84._0_4_;
                local_640 = fVar171;
                fStack_63c = fVar171;
                fStack_638 = fVar171;
                fStack_634 = fVar171;
                local_630 = auVar82;
                fVar177 = sqrtf(fVar173);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar84 = ZEXT416((uint)local_620._0_4_);
                auVar79 = ZEXT416((uint)local_6a0._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar81 = local_7a0._0_16_;
                auVar82 = local_630;
                fVar171 = local_640;
                fVar173 = fStack_63c;
                fVar179 = fStack_638;
                fVar181 = fStack_634;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                fVar177 = auVar86._0_4_;
                fVar173 = fVar171;
                fVar179 = fVar171;
                fVar181 = fVar171;
              }
              auVar274 = ZEXT3264(local_740);
              auVar250 = ZEXT3264(local_880);
              auVar251 = ZEXT3264(local_860);
              auVar259 = ZEXT3264(local_8a0);
              auVar273 = ZEXT3264(local_7c0);
              auVar271 = ZEXT3264(local_8c0);
              auVar263 = ZEXT3264(local_8e0);
              auVar264 = ZEXT3264(local_900);
              auVar265 = ZEXT3264(local_920);
              auVar266 = ZEXT3264(local_7e0);
              auVar267 = ZEXT3264(local_940);
              auVar268 = ZEXT3264(local_800);
              auVar269 = ZEXT3264(local_960);
              auVar270 = ZEXT3264(local_980);
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_760._0_16_,
                                        local_4e0._0_16_);
              fVar153 = auVar86._0_4_ * 6.0;
              fVar172 = local_760._0_4_ * 6.0;
              auVar190._0_4_ = fVar172 * (float)local_5e0._0_4_;
              auVar190._4_4_ = fVar172 * (float)local_5e0._4_4_;
              auVar190._8_4_ = fVar172 * fStack_5d8;
              auVar190._12_4_ = fVar172 * fStack_5d4;
              auVar160._4_4_ = fVar153;
              auVar160._0_4_ = fVar153;
              auVar160._8_4_ = fVar153;
              auVar160._12_4_ = fVar153;
              auVar86 = vfmadd132ps_fma(auVar160,auVar190,local_5a0._0_16_);
              auVar272 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_760._0_16_);
              fVar153 = auVar272._0_4_ * 6.0;
              auVar191._4_4_ = fVar153;
              auVar191._0_4_ = fVar153;
              auVar191._8_4_ = fVar153;
              auVar191._12_4_ = fVar153;
              auVar86 = vfmadd132ps_fma(auVar191,auVar86,local_5c0._0_16_);
              fVar153 = local_4e0._0_4_ * 6.0;
              auVar161._4_4_ = fVar153;
              auVar161._0_4_ = fVar153;
              auVar161._8_4_ = fVar153;
              auVar161._12_4_ = fVar153;
              auVar86 = vfmadd132ps_fma(auVar161,auVar86,local_580._0_16_);
              auVar192._0_4_ = auVar86._0_4_ * (float)local_500._0_4_;
              auVar192._4_4_ = auVar86._4_4_ * (float)local_500._0_4_;
              auVar192._8_4_ = auVar86._8_4_ * (float)local_500._0_4_;
              auVar192._12_4_ = auVar86._12_4_ * (float)local_500._0_4_;
              auVar86 = vdpps_avx(auVar81,auVar86,0x7f);
              fVar153 = auVar86._0_4_;
              auVar162._0_4_ = auVar81._0_4_ * fVar153;
              auVar162._4_4_ = auVar81._4_4_ * fVar153;
              auVar162._8_4_ = auVar81._8_4_ * fVar153;
              auVar162._12_4_ = auVar81._12_4_ * fVar153;
              auVar86 = vsubps_avx(auVar192,auVar162);
              fVar153 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar85 = vxorps_avx512vl(auVar81,auVar34);
              auVar223._0_4_ = fVar171 * auVar86._0_4_ * fVar153;
              auVar223._4_4_ = fVar173 * auVar86._4_4_ * fVar153;
              auVar223._8_4_ = fVar179 * auVar86._8_4_ * fVar153;
              auVar223._12_4_ = fVar181 * auVar86._12_4_ * fVar153;
              auVar86 = vdpps_avx(auVar85,auVar140,0x7f);
              auVar87 = vmaxss_avx(ZEXT416((uint)fVar152),
                                   ZEXT416((uint)((float)local_780._0_4_ * fVar175 * 1.9073486e-06))
                                  );
              auVar272 = vdpps_avx(auVar78,auVar223,0x7f);
              auVar79 = vfmadd213ss_fma(auVar79,ZEXT416((uint)fVar152),auVar87);
              vfmadd213ss_avx512f(auVar83,ZEXT416((uint)(fVar152 / fVar134)),auVar79);
              auVar79 = vdpps_avx(local_6f0,auVar140,0x7f);
              fVar171 = auVar86._0_4_ + auVar272._0_4_;
              auVar86 = vdpps_avx(auVar78,auVar85,0x7f);
              auVar83 = vmulss_avx512f(auVar80,auVar82);
              auVar80 = vmulss_avx512f(auVar82,auVar82);
              auVar82 = vdpps_avx(auVar78,local_6f0,0x7f);
              auVar80 = vaddss_avx512f(auVar84,ZEXT416((uint)(auVar83._0_4_ * auVar80._0_4_)));
              auVar262 = ZEXT1664(local_720._0_16_);
              auVar83 = vfnmadd231ss_fma(auVar86,local_720._0_16_,ZEXT416((uint)fVar171));
              auVar84 = vfnmadd231ss_fma(auVar82,local_720._0_16_,auVar79);
              auVar86 = vpermilps_avx(_local_4c0,0xff);
              fVar177 = fVar177 - auVar86._0_4_;
              auVar86 = vshufps_avx(auVar81,auVar81,0xff);
              auVar82 = vfmsub213ss_fma(auVar83,auVar80,auVar86);
              fVar173 = auVar84._0_4_ * auVar80._0_4_;
              auVar83 = vfmsub231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar82._0_4_)),
                                        ZEXT416((uint)fVar171),ZEXT416((uint)fVar173));
              fVar134 = auVar83._0_4_;
              fVar173 = local_760._0_4_ -
                        (local_720._0_4_ * (fVar173 / fVar134) - fVar177 * (auVar79._0_4_ / fVar134)
                        );
              uVar154 = 0;
              uVar253 = 0;
              uVar254 = 0;
              fVar171 = (float)local_780._0_4_ -
                        (fVar177 * (fVar171 / fVar134) - local_720._0_4_ * (auVar82._0_4_ / fVar134)
                        );
              uVar255 = 0;
              uVar256 = 0;
              uVar257 = 0;
              auVar35._8_4_ = 0x7fffffff;
              auVar35._0_8_ = 0x7fffffff7fffffff;
              auVar35._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(local_720._0_16_,auVar35);
              auVar79 = vucomiss_avx512f(auVar79);
              if (!(bool)uVar68 && !(bool)uVar69) {
                auVar79 = vaddss_avx512f(auVar87,auVar79);
                auVar79 = vfmadd231ss_fma(auVar79,local_650,ZEXT416(0x36000000));
                auVar36._8_4_ = 0x7fffffff;
                auVar36._0_8_ = 0x7fffffff7fffffff;
                auVar36._12_4_ = 0x7fffffff;
                auVar82 = vandps_avx512vl(ZEXT416((uint)fVar177),auVar36);
                if (auVar82._0_4_ < auVar79._0_4_) {
                  fVar171 = fVar171 + (float)local_660._0_4_;
                  if ((((fVar171 < fVar133) ||
                       (fVar175 = *(float *)(ray + k * 4 + 0x80), fVar175 < fVar171)) ||
                      (fVar173 < 0.0)) || (1.0 < fVar173)) break;
                  auVar193._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar193._0_4_ = local_680._0_4_;
                  auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar193);
                  fVar134 = auVar79._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar66].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar134 = fVar134 * 1.5 +
                            (float)local_680._0_4_ * -0.5 * fVar134 * fVar134 * fVar134;
                  local_9e0 = auVar78._0_4_;
                  fStack_9dc = auVar78._4_4_;
                  fStack_9d8 = auVar78._8_4_;
                  fStack_9d4 = auVar78._12_4_;
                  auVar194._0_4_ = fVar134 * local_9e0;
                  auVar194._4_4_ = fVar134 * fStack_9dc;
                  auVar194._8_4_ = fVar134 * fStack_9d8;
                  auVar194._12_4_ = fVar134 * fStack_9d4;
                  auVar86 = vfmadd213ps_fma(auVar86,auVar194,auVar81);
                  auVar79 = vshufps_avx(auVar194,auVar194,0xc9);
                  auVar78 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar195._0_4_ = auVar194._0_4_ * auVar78._0_4_;
                  auVar195._4_4_ = auVar194._4_4_ * auVar78._4_4_;
                  auVar195._8_4_ = auVar194._8_4_ * auVar78._8_4_;
                  auVar195._12_4_ = auVar194._12_4_ * auVar78._12_4_;
                  auVar81 = vfmsub231ps_fma(auVar195,auVar81,auVar79);
                  auVar79 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar78 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                  auVar142._0_4_ = auVar86._0_4_ * auVar81._0_4_;
                  auVar142._4_4_ = auVar86._4_4_ * auVar81._4_4_;
                  auVar142._8_4_ = auVar86._8_4_ * auVar81._8_4_;
                  auVar142._12_4_ = auVar86._12_4_ * auVar81._12_4_;
                  auVar79 = vfmsub231ps_fma(auVar142,auVar79,auVar78);
                  uVar154 = auVar79._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar171;
                    uVar253 = vextractps_avx(auVar79,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar253;
                    uVar253 = vextractps_avx(auVar79,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar253;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar154;
                    *(float *)(ray + k * 4 + 0xf0) = fVar173;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(uint *)(ray + k * 4 + 0x110) = uVar7;
                    *(uint *)(ray + k * 4 + 0x120) = uVar66;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar79,auVar79,0x55);
                  auStack_450 = vshufps_avx(auVar79,auVar79,0xaa);
                  local_440 = uVar154;
                  uStack_43c = uVar154;
                  uStack_438 = uVar154;
                  uStack_434 = uVar154;
                  local_430 = fVar173;
                  fStack_42c = fVar173;
                  fStack_428 = fVar173;
                  fStack_424 = fVar173;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar171;
                  local_9a0 = local_490;
                  local_830.valid = (int *)local_9a0;
                  local_830.geometryUserPtr = pGVar8->userPtr;
                  local_830.context = context->user;
                  local_830.hit = local_460;
                  local_830.N = 4;
                  local_7a0._0_4_ = fVar175;
                  local_830.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar262 = ZEXT1664(local_720._0_16_);
                    (*pGVar8->intersectionFilterN)(&local_830);
                    auVar270 = ZEXT3264(local_980);
                    auVar269 = ZEXT3264(local_960);
                    auVar268 = ZEXT3264(local_800);
                    auVar267 = ZEXT3264(local_940);
                    auVar266 = ZEXT3264(local_7e0);
                    auVar265 = ZEXT3264(local_920);
                    auVar264 = ZEXT3264(local_900);
                    auVar263 = ZEXT3264(local_8e0);
                    auVar271 = ZEXT3264(local_8c0);
                    auVar273 = ZEXT3264(local_7c0);
                    auVar259 = ZEXT3264(local_8a0);
                    auVar251 = ZEXT3264(local_860);
                    auVar250 = ZEXT3264(local_880);
                    auVar274 = ZEXT3264(local_740);
                    fVar175 = (float)local_7a0._0_4_;
                  }
                  uVar71 = vptestmd_avx512vl(local_9a0,local_9a0);
                  if ((uVar71 & 0xf) != 0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar262 = ZEXT1664(auVar262._0_16_);
                      (*p_Var13)(&local_830);
                      auVar270 = ZEXT3264(local_980);
                      auVar269 = ZEXT3264(local_960);
                      auVar268 = ZEXT3264(local_800);
                      auVar267 = ZEXT3264(local_940);
                      auVar266 = ZEXT3264(local_7e0);
                      auVar265 = ZEXT3264(local_920);
                      auVar264 = ZEXT3264(local_900);
                      auVar263 = ZEXT3264(local_8e0);
                      auVar271 = ZEXT3264(local_8c0);
                      auVar273 = ZEXT3264(local_7c0);
                      auVar259 = ZEXT3264(local_8a0);
                      auVar251 = ZEXT3264(local_860);
                      auVar250 = ZEXT3264(local_880);
                      auVar274 = ZEXT3264(local_740);
                      fVar175 = (float)local_7a0._0_4_;
                    }
                    uVar71 = vptestmd_avx512vl(local_9a0,local_9a0);
                    uVar71 = uVar71 & 0xf;
                    bVar70 = (byte)uVar71;
                    if (bVar70 != 0) {
                      iVar3 = *(int *)(local_830.hit + 4);
                      iVar4 = *(int *)(local_830.hit + 8);
                      iVar1 = *(int *)(local_830.hit + 0xc);
                      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
                      bVar16 = SUB81(uVar71 >> 3,0);
                      *(uint *)(local_830.ray + 0xc0) =
                           (uint)(bVar70 & 1) * *(int *)local_830.hit |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_830.ray + 0xc0);
                      *(uint *)(local_830.ray + 0xc4) =
                           (uint)bVar14 * iVar3 | (uint)!bVar14 * *(int *)(local_830.ray + 0xc4);
                      *(uint *)(local_830.ray + 200) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_830.ray + 200);
                      *(uint *)(local_830.ray + 0xcc) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_830.ray + 0xcc);
                      iVar3 = *(int *)(local_830.hit + 0x14);
                      iVar4 = *(int *)(local_830.hit + 0x18);
                      iVar1 = *(int *)(local_830.hit + 0x1c);
                      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
                      bVar16 = SUB81(uVar71 >> 3,0);
                      *(uint *)(local_830.ray + 0xd0) =
                           (uint)(bVar70 & 1) * *(int *)(local_830.hit + 0x10) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_830.ray + 0xd0);
                      *(uint *)(local_830.ray + 0xd4) =
                           (uint)bVar14 * iVar3 | (uint)!bVar14 * *(int *)(local_830.ray + 0xd4);
                      *(uint *)(local_830.ray + 0xd8) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_830.ray + 0xd8);
                      *(uint *)(local_830.ray + 0xdc) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_830.ray + 0xdc);
                      iVar3 = *(int *)(local_830.hit + 0x24);
                      iVar4 = *(int *)(local_830.hit + 0x28);
                      iVar1 = *(int *)(local_830.hit + 0x2c);
                      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
                      bVar16 = SUB81(uVar71 >> 3,0);
                      *(uint *)(local_830.ray + 0xe0) =
                           (uint)(bVar70 & 1) * *(int *)(local_830.hit + 0x20) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_830.ray + 0xe0);
                      *(uint *)(local_830.ray + 0xe4) =
                           (uint)bVar14 * iVar3 | (uint)!bVar14 * *(int *)(local_830.ray + 0xe4);
                      *(uint *)(local_830.ray + 0xe8) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_830.ray + 0xe8);
                      *(uint *)(local_830.ray + 0xec) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_830.ray + 0xec);
                      iVar3 = *(int *)(local_830.hit + 0x34);
                      iVar4 = *(int *)(local_830.hit + 0x38);
                      iVar1 = *(int *)(local_830.hit + 0x3c);
                      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
                      bVar16 = SUB81(uVar71 >> 3,0);
                      *(uint *)(local_830.ray + 0xf0) =
                           (uint)(bVar70 & 1) * *(int *)(local_830.hit + 0x30) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_830.ray + 0xf0);
                      *(uint *)(local_830.ray + 0xf4) =
                           (uint)bVar14 * iVar3 | (uint)!bVar14 * *(int *)(local_830.ray + 0xf4);
                      *(uint *)(local_830.ray + 0xf8) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_830.ray + 0xf8);
                      *(uint *)(local_830.ray + 0xfc) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_830.ray + 0xfc);
                      iVar3 = *(int *)(local_830.hit + 0x44);
                      iVar4 = *(int *)(local_830.hit + 0x48);
                      iVar1 = *(int *)(local_830.hit + 0x4c);
                      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
                      bVar16 = SUB81(uVar71 >> 3,0);
                      *(uint *)(local_830.ray + 0x100) =
                           (uint)(bVar70 & 1) * *(int *)(local_830.hit + 0x40) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_830.ray + 0x100);
                      *(uint *)(local_830.ray + 0x104) =
                           (uint)bVar14 * iVar3 | (uint)!bVar14 * *(int *)(local_830.ray + 0x104);
                      *(uint *)(local_830.ray + 0x108) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_830.ray + 0x108);
                      *(uint *)(local_830.ray + 0x10c) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_830.ray + 0x10c);
                      auVar79 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x50));
                      *(undefined1 (*) [16])(local_830.ray + 0x110) = auVar79;
                      auVar79 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x60));
                      *(undefined1 (*) [16])(local_830.ray + 0x120) = auVar79;
                      auVar79 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x70));
                      *(undefined1 (*) [16])(local_830.ray + 0x130) = auVar79;
                      auVar79 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x80));
                      *(undefined1 (*) [16])(local_830.ray + 0x140) = auVar79;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar175;
                  break;
                }
              }
              lVar67 = lVar67 + -1;
            } while (lVar67 != 0);
            uVar154 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar150._4_4_ = uVar154;
            auVar150._0_4_ = uVar154;
            auVar150._8_4_ = uVar154;
            auVar150._12_4_ = uVar154;
            auVar150._16_4_ = uVar154;
            auVar150._20_4_ = uVar154;
            auVar150._24_4_ = uVar154;
            auVar150._28_4_ = uVar154;
            auVar57._4_4_ = fStack_33c;
            auVar57._0_4_ = local_340;
            auVar57._8_4_ = fStack_338;
            auVar57._12_4_ = fStack_334;
            auVar57._16_4_ = fStack_330;
            auVar57._20_4_ = fStack_32c;
            auVar57._24_4_ = fStack_328;
            auVar57._28_4_ = fStack_324;
            uVar22 = vcmpps_avx512vl(auVar150,auVar57,0xd);
            bVar65 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar65 & (byte)uVar22;
          } while (bVar65 != 0);
          uVar72 = (ulong)local_98c;
          auVar90 = local_2a0;
        }
        bVar65 = local_360[0] | (byte)uVar72;
        auVar169._0_4_ = (float)local_6c0._0_4_ + auVar90._0_4_;
        auVar169._4_4_ = (float)local_6c0._4_4_ + auVar90._4_4_;
        auVar169._8_4_ = fStack_6b8 + auVar90._8_4_;
        auVar169._12_4_ = fStack_6b4 + auVar90._12_4_;
        auVar169._16_4_ = fStack_6b0 + auVar90._16_4_;
        auVar169._20_4_ = fStack_6ac + auVar90._20_4_;
        auVar169._24_4_ = fStack_6a8 + auVar90._24_4_;
        auVar169._28_4_ = fStack_6a4 + auVar90._28_4_;
        uVar22 = vcmpps_avx512vl(auVar169,auVar150,2);
        bVar60 = (byte)uVar23 & bVar60 & (byte)uVar22;
        auVar170._8_4_ = 2;
        auVar170._0_8_ = 0x200000002;
        auVar170._12_4_ = 2;
        auVar170._16_4_ = 2;
        auVar170._20_4_ = 2;
        auVar170._24_4_ = 2;
        auVar170._28_4_ = 2;
        auVar44._8_4_ = 3;
        auVar44._0_8_ = 0x300000003;
        auVar44._12_4_ = 3;
        auVar44._16_4_ = 3;
        auVar44._20_4_ = 3;
        auVar44._24_4_ = 3;
        auVar44._28_4_ = 3;
        auVar88 = vpblendmd_avx512vl(auVar170,auVar44);
        auVar123._0_4_ = (uint)(bVar65 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar65 & 1) * 2;
        bVar14 = (bool)(bVar65 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar14 * auVar88._16_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar14 * auVar88._20_4_ | (uint)!bVar14 * 2;
        bVar14 = (bool)(bVar65 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar14 * auVar88._24_4_ | (uint)!bVar14 * 2;
        auVar123._28_4_ = (uint)(bVar65 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar65 >> 7) * 2;
        uVar22 = vpcmpd_avx512vl(local_300,auVar123,5);
        bVar65 = (byte)uVar22 & bVar60;
        fVar152 = (float)local_6c0._0_4_;
        fVar171 = (float)local_6c0._4_4_;
        fVar173 = fStack_6b8;
        fVar175 = fStack_6b4;
        fVar134 = fStack_6b0;
        fVar177 = fStack_6ac;
        fVar179 = fStack_6a8;
        fVar181 = fStack_6a4;
        if (bVar65 != 0) {
          local_360 = auVar123;
          auVar78 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar79 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar81 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar86 = vminps_avx(auVar78,auVar81);
          auVar78 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar81 = vmaxps_avx(auVar79,auVar78);
          auVar196._8_4_ = 0x7fffffff;
          auVar196._0_8_ = 0x7fffffff7fffffff;
          auVar196._12_4_ = 0x7fffffff;
          auVar79 = vandps_avx(auVar86,auVar196);
          auVar78 = vandps_avx(auVar81,auVar196);
          auVar79 = vmaxps_avx(auVar79,auVar78);
          auVar78 = vmovshdup_avx(auVar79);
          auVar78 = vmaxss_avx(auVar78,auVar79);
          auVar79 = vshufpd_avx(auVar79,auVar79,1);
          auVar79 = vmaxss_avx(auVar79,auVar78);
          fVar152 = auVar79._0_4_ * 1.9073486e-06;
          local_650 = vshufps_avx(auVar81,auVar81,0xff);
          local_340 = (float)local_6c0._0_4_ + local_2e0._0_4_;
          fStack_33c = (float)local_6c0._4_4_ + local_2e0._4_4_;
          fStack_338 = fStack_6b8 + local_2e0._8_4_;
          fStack_334 = fStack_6b4 + local_2e0._12_4_;
          fStack_330 = fStack_6b0 + local_2e0._16_4_;
          fStack_32c = fStack_6ac + local_2e0._20_4_;
          fStack_328 = fStack_6a8 + local_2e0._24_4_;
          fStack_324 = fStack_6a4 + local_2e0._28_4_;
          _local_600 = local_2e0;
          do {
            auVar151._8_4_ = 0x7f800000;
            auVar151._0_8_ = 0x7f8000007f800000;
            auVar151._12_4_ = 0x7f800000;
            auVar151._16_4_ = 0x7f800000;
            auVar151._20_4_ = 0x7f800000;
            auVar151._24_4_ = 0x7f800000;
            auVar151._28_4_ = 0x7f800000;
            auVar88 = vblendmps_avx512vl(auVar151,_local_600);
            auVar124._0_4_ =
                 (uint)(bVar65 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 1 & 1);
            auVar124._4_4_ = (uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 2 & 1);
            auVar124._8_4_ = (uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 3 & 1);
            auVar124._12_4_ = (uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 4 & 1);
            auVar124._16_4_ = (uint)bVar14 * auVar88._16_4_ | (uint)!bVar14 * 0x7f800000;
            bVar14 = (bool)(bVar65 >> 5 & 1);
            auVar124._20_4_ = (uint)bVar14 * auVar88._20_4_ | (uint)!bVar14 * 0x7f800000;
            auVar124._24_4_ =
                 (uint)(bVar65 >> 6) * auVar88._24_4_ | (uint)!(bool)(bVar65 >> 6) * 0x7f800000;
            auVar124._28_4_ = 0x7f800000;
            auVar88 = vshufps_avx(auVar124,auVar124,0xb1);
            auVar88 = vminps_avx(auVar124,auVar88);
            auVar90 = vshufpd_avx(auVar88,auVar88,5);
            auVar88 = vminps_avx(auVar88,auVar90);
            auVar90 = vpermpd_avx2(auVar88,0x4e);
            auVar88 = vminps_avx(auVar88,auVar90);
            uVar22 = vcmpps_avx512vl(auVar124,auVar88,0);
            bVar61 = (byte)uVar22 & bVar65;
            bVar70 = bVar65;
            if (bVar61 != 0) {
              bVar70 = bVar61;
            }
            iVar2 = 0;
            for (uVar74 = (uint)bVar70; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            fVar175 = local_984;
            fVar173 = *(float *)(local_1c0 + (uint)(iVar2 << 2));
            uVar154 = 0;
            uVar253 = 0;
            uVar254 = 0;
            fVar171 = *(float *)(local_2c0 + (uint)(iVar2 << 2));
            uVar255 = 0;
            uVar256 = 0;
            uVar257 = 0;
            if ((float)local_700._0_4_ < 0.0) {
              local_760._0_16_ = ZEXT416((uint)*(float *)(local_1c0 + (uint)(iVar2 << 2)));
              local_780._0_16_ = ZEXT416((uint)*(float *)(local_2c0 + (uint)(iVar2 << 2)));
              fVar175 = sqrtf((float)local_700._0_4_);
              fVar173 = (float)local_760._0_4_;
              uVar154 = local_760._4_4_;
              uVar253 = local_760._8_4_;
              uVar254 = local_760._12_4_;
              fVar171 = (float)local_780._0_4_;
              uVar255 = local_780._4_4_;
              uVar256 = local_780._8_4_;
              uVar257 = local_780._12_4_;
            }
            lVar67 = 5;
            do {
              auVar90 = local_760;
              auVar88 = local_780;
              auVar143._4_4_ = fVar171;
              auVar143._0_4_ = fVar171;
              auVar143._8_4_ = fVar171;
              auVar143._12_4_ = fVar171;
              auVar78 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_6f0);
              fVar134 = 1.0 - fVar173;
              auVar197._0_4_ = local_5c0._0_4_ * fVar173;
              auVar197._4_4_ = local_5c0._4_4_ * fVar173;
              auVar197._8_4_ = local_5c0._8_4_ * fVar173;
              auVar197._12_4_ = local_5c0._12_4_ * fVar173;
              local_4e0._0_16_ = ZEXT416((uint)fVar134);
              auVar216._4_4_ = fVar134;
              auVar216._0_4_ = fVar134;
              auVar216._8_4_ = fVar134;
              auVar216._12_4_ = fVar134;
              auVar79 = vfmadd231ps_fma(auVar197,auVar216,local_580._0_16_);
              auVar224._0_4_ = local_5a0._0_4_ * fVar173;
              auVar224._4_4_ = local_5a0._4_4_ * fVar173;
              auVar224._8_4_ = local_5a0._8_4_ * fVar173;
              auVar224._12_4_ = local_5a0._12_4_ * fVar173;
              auVar81 = vfmadd231ps_fma(auVar224,auVar216,local_5c0._0_16_);
              auVar235._0_4_ = fVar173 * (float)local_5e0._0_4_;
              auVar235._4_4_ = fVar173 * (float)local_5e0._4_4_;
              auVar235._8_4_ = fVar173 * fStack_5d8;
              auVar235._12_4_ = fVar173 * fStack_5d4;
              auVar86 = vfmadd231ps_fma(auVar235,auVar216,local_5a0._0_16_);
              auVar242._0_4_ = fVar173 * auVar81._0_4_;
              auVar242._4_4_ = fVar173 * auVar81._4_4_;
              auVar242._8_4_ = fVar173 * auVar81._8_4_;
              auVar242._12_4_ = fVar173 * auVar81._12_4_;
              auVar79 = vfmadd231ps_fma(auVar242,auVar216,auVar79);
              auVar198._0_4_ = fVar173 * auVar86._0_4_;
              auVar198._4_4_ = fVar173 * auVar86._4_4_;
              auVar198._8_4_ = fVar173 * auVar86._8_4_;
              auVar198._12_4_ = fVar173 * auVar86._12_4_;
              auVar81 = vfmadd231ps_fma(auVar198,auVar216,auVar81);
              auVar225._0_4_ = fVar173 * auVar81._0_4_;
              auVar225._4_4_ = fVar173 * auVar81._4_4_;
              auVar225._8_4_ = fVar173 * auVar81._8_4_;
              auVar225._12_4_ = fVar173 * auVar81._12_4_;
              auVar86 = vfmadd231ps_fma(auVar225,auVar79,auVar216);
              auVar79 = vsubps_avx(auVar81,auVar79);
              auVar37._8_4_ = 0x40400000;
              auVar37._0_8_ = 0x4040000040400000;
              auVar37._12_4_ = 0x40400000;
              auVar81 = vmulps_avx512vl(auVar79,auVar37);
              _local_4c0 = auVar86;
              auVar79 = vsubps_avx(auVar78,auVar86);
              local_7a0._0_16_ = auVar79;
              auVar79 = vdpps_avx(auVar79,auVar79,0x7f);
              local_680._0_16_ = auVar79;
              local_760._4_4_ = uVar154;
              local_760._0_4_ = fVar173;
              local_760._8_4_ = uVar253;
              local_760._16_16_ = auVar90._16_16_;
              local_760._12_4_ = uVar254;
              local_780._4_4_ = uVar255;
              local_780._0_4_ = fVar171;
              local_780._8_4_ = uVar256;
              local_780._16_16_ = auVar88._16_16_;
              local_780._12_4_ = uVar257;
              if (auVar79._0_4_ < 0.0) {
                auVar250._0_4_ = sqrtf(auVar79._0_4_);
                auVar250._4_60_ = extraout_var_00;
                auVar79 = auVar250._0_16_;
              }
              else {
                auVar79 = vsqrtss_avx(auVar79,auVar79);
              }
              local_500._0_16_ = vdpps_avx(auVar81,auVar81,0x7f);
              fVar171 = local_500._0_4_;
              auVar199._4_12_ = ZEXT812(0) << 0x20;
              auVar199._0_4_ = fVar171;
              local_720._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
              fVar173 = local_720._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar199);
              auVar38._8_4_ = 0x80000000;
              auVar38._0_8_ = 0x8000000080000000;
              auVar38._12_4_ = 0x80000000;
              auVar86 = vxorps_avx512vl(local_500._0_16_,auVar38);
              auVar78 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar78._0_4_;
              local_6a0._0_4_ = auVar79._0_4_;
              if (fVar171 < auVar86._0_4_) {
                auVar251._0_4_ = sqrtf(fVar171);
                auVar251._4_60_ = extraout_var_01;
                auVar79 = ZEXT416((uint)local_6a0._0_4_);
                auVar78 = auVar251._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx512f(local_500._0_16_,local_500._0_16_);
              }
              fVar134 = local_720._0_4_;
              fVar171 = fVar173 * 1.5 + fVar171 * -0.5 * fVar134 * fVar134 * fVar134;
              auVar261._0_4_ = auVar81._0_4_ * fVar171;
              auVar261._4_4_ = auVar81._4_4_ * fVar171;
              auVar261._8_4_ = auVar81._8_4_ * fVar171;
              auVar261._12_4_ = auVar81._12_4_ * fVar171;
              local_720._0_16_ = vdpps_avx(local_7a0._0_16_,auVar261,0x7f);
              auVar83 = vaddss_avx512f(auVar79,ZEXT416(0x3f800000));
              auVar144._0_4_ = local_720._0_4_ * local_720._0_4_;
              auVar144._4_4_ = local_720._4_4_ * local_720._4_4_;
              auVar144._8_4_ = local_720._8_4_ * local_720._8_4_;
              auVar144._12_4_ = local_720._12_4_ * local_720._12_4_;
              auVar86 = vsubps_avx(local_680._0_16_,auVar144);
              fVar173 = auVar86._0_4_;
              auVar163._4_12_ = ZEXT812(0) << 0x20;
              auVar163._0_4_ = fVar173;
              auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar163);
              auVar84 = vmulss_avx512f(auVar82,ZEXT416(0x3fc00000));
              auVar80 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
              uVar69 = fVar173 == 0.0;
              uVar68 = fVar173 < 0.0;
              if ((bool)uVar68) {
                local_640 = fVar171;
                fStack_63c = fVar171;
                fStack_638 = fVar171;
                fStack_634 = fVar171;
                local_630 = auVar261;
                local_620 = auVar82;
                fVar134 = sqrtf(fVar173);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar79 = ZEXT416((uint)local_6a0._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar261 = local_630;
                auVar82 = local_620;
                fVar171 = local_640;
                fVar173 = fStack_63c;
                fVar177 = fStack_638;
                fVar179 = fStack_634;
              }
              else {
                auVar86 = vsqrtss_avx(auVar86,auVar86);
                fVar134 = auVar86._0_4_;
                fVar173 = fVar171;
                fVar177 = fVar171;
                fVar179 = fVar171;
              }
              auVar262 = ZEXT1664(local_7a0._0_16_);
              auVar274 = ZEXT3264(local_740);
              auVar250 = ZEXT3264(local_880);
              auVar251 = ZEXT3264(local_860);
              auVar259 = ZEXT3264(local_8a0);
              auVar273 = ZEXT3264(local_7c0);
              auVar271 = ZEXT3264(local_8c0);
              auVar263 = ZEXT3264(local_8e0);
              auVar264 = ZEXT3264(local_900);
              auVar265 = ZEXT3264(local_920);
              auVar266 = ZEXT3264(local_7e0);
              auVar267 = ZEXT3264(local_940);
              auVar268 = ZEXT3264(local_800);
              auVar269 = ZEXT3264(local_960);
              auVar270 = ZEXT3264(local_980);
              auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_760._0_16_,
                                        local_4e0._0_16_);
              fVar181 = auVar86._0_4_ * 6.0;
              fVar153 = local_760._0_4_ * 6.0;
              auVar200._0_4_ = fVar153 * (float)local_5e0._0_4_;
              auVar200._4_4_ = fVar153 * (float)local_5e0._4_4_;
              auVar200._8_4_ = fVar153 * fStack_5d8;
              auVar200._12_4_ = fVar153 * fStack_5d4;
              auVar164._4_4_ = fVar181;
              auVar164._0_4_ = fVar181;
              auVar164._8_4_ = fVar181;
              auVar164._12_4_ = fVar181;
              auVar86 = vfmadd132ps_fma(auVar164,auVar200,local_5a0._0_16_);
              auVar272 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_760._0_16_);
              fVar181 = auVar272._0_4_ * 6.0;
              auVar201._4_4_ = fVar181;
              auVar201._0_4_ = fVar181;
              auVar201._8_4_ = fVar181;
              auVar201._12_4_ = fVar181;
              auVar86 = vfmadd132ps_fma(auVar201,auVar86,local_5c0._0_16_);
              fVar181 = local_4e0._0_4_ * 6.0;
              auVar165._4_4_ = fVar181;
              auVar165._0_4_ = fVar181;
              auVar165._8_4_ = fVar181;
              auVar165._12_4_ = fVar181;
              auVar86 = vfmadd132ps_fma(auVar165,auVar86,local_580._0_16_);
              auVar202._0_4_ = auVar86._0_4_ * (float)local_500._0_4_;
              auVar202._4_4_ = auVar86._4_4_ * (float)local_500._0_4_;
              auVar202._8_4_ = auVar86._8_4_ * (float)local_500._0_4_;
              auVar202._12_4_ = auVar86._12_4_ * (float)local_500._0_4_;
              auVar86 = vdpps_avx(auVar81,auVar86,0x7f);
              fVar181 = auVar86._0_4_;
              auVar166._0_4_ = auVar81._0_4_ * fVar181;
              auVar166._4_4_ = auVar81._4_4_ * fVar181;
              auVar166._8_4_ = auVar81._8_4_ * fVar181;
              auVar166._12_4_ = auVar81._12_4_ * fVar181;
              auVar86 = vsubps_avx(auVar202,auVar166);
              fVar181 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar39._8_4_ = 0x80000000;
              auVar39._0_8_ = 0x8000000080000000;
              auVar39._12_4_ = 0x80000000;
              auVar87 = vxorps_avx512vl(auVar81,auVar39);
              auVar226._0_4_ = fVar171 * auVar86._0_4_ * fVar181;
              auVar226._4_4_ = fVar173 * auVar86._4_4_ * fVar181;
              auVar226._8_4_ = fVar177 * auVar86._8_4_ * fVar181;
              auVar226._12_4_ = fVar179 * auVar86._12_4_ * fVar181;
              auVar86 = vdpps_avx(auVar87,auVar261,0x7f);
              auVar272 = vmaxss_avx(ZEXT416((uint)fVar152),
                                    ZEXT416((uint)((float)local_780._0_4_ * fVar175 * 1.9073486e-06)
                                           ));
              auVar85 = vdivss_avx512f(ZEXT416((uint)fVar152),auVar78);
              auVar78 = vdpps_avx(local_7a0._0_16_,auVar226,0x7f);
              auVar79 = vfmadd213ss_fma(auVar79,ZEXT416((uint)fVar152),auVar272);
              vfmadd213ss_avx512f(auVar83,auVar85,auVar79);
              auVar79 = vdpps_avx(local_6f0,auVar261,0x7f);
              fVar171 = auVar86._0_4_ + auVar78._0_4_;
              auVar78 = vdpps_avx(local_7a0._0_16_,auVar87,0x7f);
              auVar83 = vmulss_avx512f(auVar80,auVar82);
              auVar82 = vmulss_avx512f(auVar82,auVar82);
              auVar86 = vdpps_avx(local_7a0._0_16_,local_6f0,0x7f);
              auVar82 = vaddss_avx512f(auVar84,ZEXT416((uint)(auVar83._0_4_ * auVar82._0_4_)));
              auVar83 = vfnmadd231ss_avx512f(auVar78,local_720._0_16_,ZEXT416((uint)fVar171));
              auVar84 = vfnmadd231ss_avx512f(auVar86,local_720._0_16_,auVar79);
              auVar78 = vpermilps_avx(_local_4c0,0xff);
              fVar134 = fVar134 - auVar78._0_4_;
              auVar78 = vshufps_avx(auVar81,auVar81,0xff);
              auVar86 = vfmsub213ss_fma(auVar83,auVar82,auVar78);
              fVar173 = auVar84._0_4_ * auVar82._0_4_;
              auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar86._0_4_)),
                                        ZEXT416((uint)fVar171),ZEXT416((uint)fVar173));
              fVar177 = auVar82._0_4_;
              auVar243._0_4_ = fVar173 / fVar177;
              auVar243._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar236._0_4_ = auVar86._0_4_ / fVar177;
              auVar236._4_12_ = auVar86._4_12_;
              auVar86 = vmulss_avx512f(local_720._0_16_,auVar243);
              auVar82 = vmulss_avx512f(local_720._0_16_,auVar236);
              fVar173 = local_760._0_4_ - (auVar86._0_4_ - fVar134 * (auVar79._0_4_ / fVar177));
              uVar154 = 0;
              uVar253 = 0;
              uVar254 = 0;
              fVar171 = (float)local_780._0_4_ - (fVar134 * (fVar171 / fVar177) - auVar82._0_4_);
              uVar255 = 0;
              uVar256 = 0;
              uVar257 = 0;
              auVar40._8_4_ = 0x7fffffff;
              auVar40._0_8_ = 0x7fffffff7fffffff;
              auVar40._12_4_ = 0x7fffffff;
              auVar79 = vandps_avx512vl(local_720._0_16_,auVar40);
              auVar79 = vucomiss_avx512f(auVar79);
              if (!(bool)uVar68 && !(bool)uVar69) {
                auVar79 = vaddss_avx512f(auVar272,auVar79);
                auVar79 = vfmadd231ss_fma(auVar79,local_650,ZEXT416(0x36000000));
                auVar41._8_4_ = 0x7fffffff;
                auVar41._0_8_ = 0x7fffffff7fffffff;
                auVar41._12_4_ = 0x7fffffff;
                auVar86 = vandps_avx512vl(ZEXT416((uint)fVar134),auVar41);
                if (auVar86._0_4_ < auVar79._0_4_) {
                  fVar171 = fVar171 + (float)local_660._0_4_;
                  if ((((fVar171 < fVar133) ||
                       (fVar175 = *(float *)(ray + k * 4 + 0x80), fVar175 < fVar171)) ||
                      (fVar173 < 0.0)) || (1.0 < fVar173)) break;
                  auVar203._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar203._0_4_ = local_680._0_4_;
                  auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar203);
                  fVar134 = auVar79._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar66].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar134 = fVar134 * 1.5 +
                            (float)local_680._0_4_ * -0.5 * fVar134 * fVar134 * fVar134;
                  auVar204._0_4_ = local_7a0._0_4_ * fVar134;
                  auVar204._4_4_ = local_7a0._4_4_ * fVar134;
                  auVar204._8_4_ = local_7a0._8_4_ * fVar134;
                  auVar204._12_4_ = local_7a0._12_4_ * fVar134;
                  auVar86 = vfmadd213ps_fma(auVar78,auVar204,auVar81);
                  auVar79 = vshufps_avx(auVar204,auVar204,0xc9);
                  auVar78 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar205._0_4_ = auVar204._0_4_ * auVar78._0_4_;
                  auVar205._4_4_ = auVar204._4_4_ * auVar78._4_4_;
                  auVar205._8_4_ = auVar204._8_4_ * auVar78._8_4_;
                  auVar205._12_4_ = auVar204._12_4_ * auVar78._12_4_;
                  auVar81 = vfmsub231ps_fma(auVar205,auVar81,auVar79);
                  auVar79 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar78 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar81 = vshufps_avx(auVar81,auVar81,0xd2);
                  auVar145._0_4_ = auVar86._0_4_ * auVar81._0_4_;
                  auVar145._4_4_ = auVar86._4_4_ * auVar81._4_4_;
                  auVar145._8_4_ = auVar86._8_4_ * auVar81._8_4_;
                  auVar145._12_4_ = auVar86._12_4_ * auVar81._12_4_;
                  auVar79 = vfmsub231ps_fma(auVar145,auVar79,auVar78);
                  uVar154 = auVar79._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar171;
                    uVar253 = vextractps_avx(auVar79,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar253;
                    uVar253 = vextractps_avx(auVar79,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar253;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar154;
                    *(float *)(ray + k * 4 + 0xf0) = fVar173;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(uint *)(ray + k * 4 + 0x110) = uVar7;
                    *(uint *)(ray + k * 4 + 0x120) = uVar66;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar79,auVar79,0x55);
                  auStack_450 = vshufps_avx(auVar79,auVar79,0xaa);
                  local_440 = uVar154;
                  uStack_43c = uVar154;
                  uStack_438 = uVar154;
                  uStack_434 = uVar154;
                  local_430 = fVar173;
                  fStack_42c = fVar173;
                  fStack_428 = fVar173;
                  fStack_424 = fVar173;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar171;
                  local_9a0 = local_490;
                  local_830.valid = (int *)local_9a0;
                  local_830.geometryUserPtr = pGVar8->userPtr;
                  local_830.context = context->user;
                  local_830.hit = local_460;
                  local_830.N = 4;
                  local_830.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar262 = ZEXT1664(local_7a0._0_16_);
                    (*pGVar8->intersectionFilterN)(&local_830);
                    auVar270 = ZEXT3264(local_980);
                    auVar269 = ZEXT3264(local_960);
                    auVar268 = ZEXT3264(local_800);
                    auVar267 = ZEXT3264(local_940);
                    auVar266 = ZEXT3264(local_7e0);
                    auVar265 = ZEXT3264(local_920);
                    auVar264 = ZEXT3264(local_900);
                    auVar263 = ZEXT3264(local_8e0);
                    auVar271 = ZEXT3264(local_8c0);
                    auVar273 = ZEXT3264(local_7c0);
                    auVar259 = ZEXT3264(local_8a0);
                    auVar251 = ZEXT3264(local_860);
                    auVar250 = ZEXT3264(local_880);
                    auVar274 = ZEXT3264(local_740);
                  }
                  uVar71 = vptestmd_avx512vl(local_9a0,local_9a0);
                  if ((uVar71 & 0xf) != 0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar262 = ZEXT1664(auVar262._0_16_);
                      (*p_Var13)(&local_830);
                      auVar270 = ZEXT3264(local_980);
                      auVar269 = ZEXT3264(local_960);
                      auVar268 = ZEXT3264(local_800);
                      auVar267 = ZEXT3264(local_940);
                      auVar266 = ZEXT3264(local_7e0);
                      auVar265 = ZEXT3264(local_920);
                      auVar264 = ZEXT3264(local_900);
                      auVar263 = ZEXT3264(local_8e0);
                      auVar271 = ZEXT3264(local_8c0);
                      auVar273 = ZEXT3264(local_7c0);
                      auVar259 = ZEXT3264(local_8a0);
                      auVar251 = ZEXT3264(local_860);
                      auVar250 = ZEXT3264(local_880);
                      auVar274 = ZEXT3264(local_740);
                    }
                    uVar71 = vptestmd_avx512vl(local_9a0,local_9a0);
                    uVar71 = uVar71 & 0xf;
                    bVar70 = (byte)uVar71;
                    if (bVar70 != 0) {
                      iVar3 = *(int *)(local_830.hit + 4);
                      iVar4 = *(int *)(local_830.hit + 8);
                      iVar1 = *(int *)(local_830.hit + 0xc);
                      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
                      bVar16 = SUB81(uVar71 >> 3,0);
                      *(uint *)(local_830.ray + 0xc0) =
                           (uint)(bVar70 & 1) * *(int *)local_830.hit |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_830.ray + 0xc0);
                      *(uint *)(local_830.ray + 0xc4) =
                           (uint)bVar14 * iVar3 | (uint)!bVar14 * *(int *)(local_830.ray + 0xc4);
                      *(uint *)(local_830.ray + 200) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_830.ray + 200);
                      *(uint *)(local_830.ray + 0xcc) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_830.ray + 0xcc);
                      iVar3 = *(int *)(local_830.hit + 0x14);
                      iVar4 = *(int *)(local_830.hit + 0x18);
                      iVar1 = *(int *)(local_830.hit + 0x1c);
                      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
                      bVar16 = SUB81(uVar71 >> 3,0);
                      *(uint *)(local_830.ray + 0xd0) =
                           (uint)(bVar70 & 1) * *(int *)(local_830.hit + 0x10) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_830.ray + 0xd0);
                      *(uint *)(local_830.ray + 0xd4) =
                           (uint)bVar14 * iVar3 | (uint)!bVar14 * *(int *)(local_830.ray + 0xd4);
                      *(uint *)(local_830.ray + 0xd8) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_830.ray + 0xd8);
                      *(uint *)(local_830.ray + 0xdc) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_830.ray + 0xdc);
                      iVar3 = *(int *)(local_830.hit + 0x24);
                      iVar4 = *(int *)(local_830.hit + 0x28);
                      iVar1 = *(int *)(local_830.hit + 0x2c);
                      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
                      bVar16 = SUB81(uVar71 >> 3,0);
                      *(uint *)(local_830.ray + 0xe0) =
                           (uint)(bVar70 & 1) * *(int *)(local_830.hit + 0x20) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_830.ray + 0xe0);
                      *(uint *)(local_830.ray + 0xe4) =
                           (uint)bVar14 * iVar3 | (uint)!bVar14 * *(int *)(local_830.ray + 0xe4);
                      *(uint *)(local_830.ray + 0xe8) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_830.ray + 0xe8);
                      *(uint *)(local_830.ray + 0xec) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_830.ray + 0xec);
                      iVar3 = *(int *)(local_830.hit + 0x34);
                      iVar4 = *(int *)(local_830.hit + 0x38);
                      iVar1 = *(int *)(local_830.hit + 0x3c);
                      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
                      bVar16 = SUB81(uVar71 >> 3,0);
                      *(uint *)(local_830.ray + 0xf0) =
                           (uint)(bVar70 & 1) * *(int *)(local_830.hit + 0x30) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_830.ray + 0xf0);
                      *(uint *)(local_830.ray + 0xf4) =
                           (uint)bVar14 * iVar3 | (uint)!bVar14 * *(int *)(local_830.ray + 0xf4);
                      *(uint *)(local_830.ray + 0xf8) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_830.ray + 0xf8);
                      *(uint *)(local_830.ray + 0xfc) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_830.ray + 0xfc);
                      iVar3 = *(int *)(local_830.hit + 0x44);
                      iVar4 = *(int *)(local_830.hit + 0x48);
                      iVar1 = *(int *)(local_830.hit + 0x4c);
                      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
                      bVar16 = SUB81(uVar71 >> 3,0);
                      *(uint *)(local_830.ray + 0x100) =
                           (uint)(bVar70 & 1) * *(int *)(local_830.hit + 0x40) |
                           (uint)!(bool)(bVar70 & 1) * *(int *)(local_830.ray + 0x100);
                      *(uint *)(local_830.ray + 0x104) =
                           (uint)bVar14 * iVar3 | (uint)!bVar14 * *(int *)(local_830.ray + 0x104);
                      *(uint *)(local_830.ray + 0x108) =
                           (uint)bVar15 * iVar4 | (uint)!bVar15 * *(int *)(local_830.ray + 0x108);
                      *(uint *)(local_830.ray + 0x10c) =
                           (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_830.ray + 0x10c);
                      auVar79 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x50));
                      *(undefined1 (*) [16])(local_830.ray + 0x110) = auVar79;
                      auVar79 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x60));
                      *(undefined1 (*) [16])(local_830.ray + 0x120) = auVar79;
                      auVar79 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x70));
                      *(undefined1 (*) [16])(local_830.ray + 0x130) = auVar79;
                      auVar79 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_830.hit + 0x80));
                      *(undefined1 (*) [16])(local_830.ray + 0x140) = auVar79;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar175;
                  break;
                }
              }
              lVar67 = lVar67 + -1;
            } while (lVar67 != 0);
            uVar154 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar150._4_4_ = uVar154;
            auVar150._0_4_ = uVar154;
            auVar150._8_4_ = uVar154;
            auVar150._12_4_ = uVar154;
            auVar150._16_4_ = uVar154;
            auVar150._20_4_ = uVar154;
            auVar150._24_4_ = uVar154;
            auVar150._28_4_ = uVar154;
            auVar58._4_4_ = fStack_33c;
            auVar58._0_4_ = local_340;
            auVar58._8_4_ = fStack_338;
            auVar58._12_4_ = fStack_334;
            auVar58._16_4_ = fStack_330;
            auVar58._20_4_ = fStack_32c;
            auVar58._24_4_ = fStack_328;
            auVar58._28_4_ = fStack_324;
            uVar22 = vcmpps_avx512vl(auVar150,auVar58,0xd);
            bVar65 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar65 & (byte)uVar22;
          } while (bVar65 != 0);
          auVar123 = local_360;
          fVar152 = (float)local_6c0._0_4_;
          fVar171 = (float)local_6c0._4_4_;
          fVar173 = fStack_6b8;
          fVar175 = fStack_6b4;
          fVar134 = fStack_6b0;
          fVar177 = fStack_6ac;
          fVar179 = fStack_6a8;
          fVar181 = fStack_6a4;
        }
        auVar228 = ZEXT3264(local_6e0);
        uVar23 = vpcmpgtd_avx512vl(auVar123,local_300);
        uVar25 = vpcmpd_avx512vl(local_300,local_280,1);
        auVar210._0_4_ = fVar152 + (float)local_200._0_4_;
        auVar210._4_4_ = fVar171 + (float)local_200._4_4_;
        auVar210._8_4_ = fVar173 + fStack_1f8;
        auVar210._12_4_ = fVar175 + fStack_1f4;
        auVar210._16_4_ = fVar134 + fStack_1f0;
        auVar210._20_4_ = fVar177 + fStack_1ec;
        auVar210._24_4_ = fVar179 + fStack_1e8;
        auVar210._28_4_ = fVar181 + fStack_1e4;
        uVar22 = vcmpps_avx512vl(auVar210,auVar150,2);
        bVar62 = bVar62 & (byte)uVar25 & (byte)uVar22;
        auVar211._0_4_ = fVar152 + local_2e0._0_4_;
        auVar211._4_4_ = fVar171 + local_2e0._4_4_;
        auVar211._8_4_ = fVar173 + local_2e0._8_4_;
        auVar211._12_4_ = fVar175 + local_2e0._12_4_;
        auVar211._16_4_ = fVar134 + local_2e0._16_4_;
        auVar211._20_4_ = fVar177 + local_2e0._20_4_;
        auVar211._24_4_ = fVar179 + local_2e0._24_4_;
        auVar211._28_4_ = fVar181 + local_2e0._28_4_;
        uVar22 = vcmpps_avx512vl(auVar211,auVar150,2);
        bVar60 = bVar60 & (byte)uVar23 & (byte)uVar22 | bVar62;
        auVar245 = ZEXT3264(local_560);
        prim = local_610;
        if (bVar60 != 0) {
          uVar72 = (ulong)uVar64;
          abStack_180[uVar72 * 0x60] = bVar60;
          auVar125._0_4_ =
               (uint)(bVar62 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar62 & 1) * (int)local_2e0._0_4_;
          bVar14 = (bool)(bVar62 >> 1 & 1);
          auVar125._4_4_ = (uint)bVar14 * local_200._4_4_ | (uint)!bVar14 * (int)local_2e0._4_4_;
          bVar14 = (bool)(bVar62 >> 2 & 1);
          auVar125._8_4_ = (uint)bVar14 * (int)fStack_1f8 | (uint)!bVar14 * (int)local_2e0._8_4_;
          bVar14 = (bool)(bVar62 >> 3 & 1);
          auVar125._12_4_ = (uint)bVar14 * (int)fStack_1f4 | (uint)!bVar14 * (int)local_2e0._12_4_;
          bVar14 = (bool)(bVar62 >> 4 & 1);
          auVar125._16_4_ = (uint)bVar14 * (int)fStack_1f0 | (uint)!bVar14 * (int)local_2e0._16_4_;
          bVar14 = (bool)(bVar62 >> 5 & 1);
          auVar125._20_4_ = (uint)bVar14 * (int)fStack_1ec | (uint)!bVar14 * (int)local_2e0._20_4_;
          auVar125._24_4_ =
               (uint)(bVar62 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar62 >> 6) * (int)local_2e0._24_4_;
          auVar125._28_4_ = local_2e0._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar72 * 0x60) = auVar125;
          uVar71 = vmovlps_avx(local_310);
          (&uStack_140)[uVar72 * 0xc] = uVar71;
          aiStack_138[uVar72 * 0x18] = local_a08 + 1;
          uVar64 = uVar64 + 1;
        }
      }
    }
    do {
      uVar74 = uVar64;
      uVar73 = uVar74 - 1;
      if (uVar74 == 0) {
        uVar154 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar42._4_4_ = uVar154;
        auVar42._0_4_ = uVar154;
        auVar42._8_4_ = uVar154;
        auVar42._12_4_ = uVar154;
        uVar22 = vcmpps_avx512vl(local_320,auVar42,2);
        uVar66 = (uint)uVar22 & (uint)local_608 - 1 & (uint)local_608;
        local_608 = (ulong)uVar66;
        if (uVar66 == 0) {
          return;
        }
        goto LAB_01bd735e;
      }
      uVar71 = (ulong)uVar73;
      lVar67 = uVar71 * 0x60;
      auVar88 = *(undefined1 (*) [32])(auStack_160 + lVar67);
      auVar167._0_4_ = fVar152 + auVar88._0_4_;
      auVar167._4_4_ = fVar171 + auVar88._4_4_;
      auVar167._8_4_ = fVar173 + auVar88._8_4_;
      auVar167._12_4_ = fVar175 + auVar88._12_4_;
      auVar167._16_4_ = fVar134 + auVar88._16_4_;
      auVar167._20_4_ = fVar177 + auVar88._20_4_;
      auVar167._24_4_ = fVar179 + auVar88._24_4_;
      auVar167._28_4_ = fVar181 + auVar88._28_4_;
      uVar154 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar45._4_4_ = uVar154;
      auVar45._0_4_ = uVar154;
      auVar45._8_4_ = uVar154;
      auVar45._12_4_ = uVar154;
      auVar45._16_4_ = uVar154;
      auVar45._20_4_ = uVar154;
      auVar45._24_4_ = uVar154;
      auVar45._28_4_ = uVar154;
      uVar22 = vcmpps_avx512vl(auVar167,auVar45,2);
      uVar126 = (uint)uVar22 & (uint)abStack_180[lVar67];
      uVar64 = uVar73;
    } while (uVar126 == 0);
    uVar72 = (&uStack_140)[uVar71 * 0xc];
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar72;
    auVar208._8_4_ = 0x7f800000;
    auVar208._0_8_ = 0x7f8000007f800000;
    auVar208._12_4_ = 0x7f800000;
    auVar208._16_4_ = 0x7f800000;
    auVar208._20_4_ = 0x7f800000;
    auVar208._24_4_ = 0x7f800000;
    auVar208._28_4_ = 0x7f800000;
    auVar90 = vblendmps_avx512vl(auVar208,auVar88);
    bVar60 = (byte)uVar126;
    auVar121._0_4_ =
         (uint)(bVar60 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar60 & 1) * (int)auVar88._0_4_;
    bVar14 = (bool)((byte)(uVar126 >> 1) & 1);
    auVar121._4_4_ = (uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * (int)auVar88._4_4_;
    bVar14 = (bool)((byte)(uVar126 >> 2) & 1);
    auVar121._8_4_ = (uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * (int)auVar88._8_4_;
    bVar14 = (bool)((byte)(uVar126 >> 3) & 1);
    auVar121._12_4_ = (uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * (int)auVar88._12_4_;
    bVar14 = (bool)((byte)(uVar126 >> 4) & 1);
    auVar121._16_4_ = (uint)bVar14 * auVar90._16_4_ | (uint)!bVar14 * (int)auVar88._16_4_;
    bVar14 = (bool)((byte)(uVar126 >> 5) & 1);
    auVar121._20_4_ = (uint)bVar14 * auVar90._20_4_ | (uint)!bVar14 * (int)auVar88._20_4_;
    bVar14 = (bool)((byte)(uVar126 >> 6) & 1);
    auVar121._24_4_ = (uint)bVar14 * auVar90._24_4_ | (uint)!bVar14 * (int)auVar88._24_4_;
    auVar121._28_4_ =
         (uVar126 >> 7) * auVar90._28_4_ | (uint)!SUB41(uVar126 >> 7,0) * (int)auVar88._28_4_;
    auVar88 = vshufps_avx(auVar121,auVar121,0xb1);
    auVar88 = vminps_avx(auVar121,auVar88);
    auVar90 = vshufpd_avx(auVar88,auVar88,5);
    auVar88 = vminps_avx(auVar88,auVar90);
    auVar90 = vpermpd_avx2(auVar88,0x4e);
    auVar88 = vminps_avx(auVar88,auVar90);
    uVar22 = vcmpps_avx512vl(auVar121,auVar88,0);
    bVar62 = (byte)uVar22 & bVar60;
    if (bVar62 != 0) {
      uVar126 = (uint)bVar62;
    }
    uVar127 = 0;
    for (; (uVar126 & 1) == 0; uVar126 = uVar126 >> 1 | 0x80000000) {
      uVar127 = uVar127 + 1;
    }
    local_a08 = aiStack_138[uVar71 * 0x18];
    bVar60 = ~('\x01' << ((byte)uVar127 & 0x1f)) & bVar60;
    abStack_180[lVar67] = bVar60;
    uVar64 = uVar74;
    if (bVar60 == 0) {
      uVar64 = uVar73;
    }
    uVar154 = (undefined4)uVar72;
    auVar147._4_4_ = uVar154;
    auVar147._0_4_ = uVar154;
    auVar147._8_4_ = uVar154;
    auVar147._12_4_ = uVar154;
    auVar147._16_4_ = uVar154;
    auVar147._20_4_ = uVar154;
    auVar147._24_4_ = uVar154;
    auVar147._28_4_ = uVar154;
    auVar79 = vmovshdup_avx(auVar158);
    auVar79 = vsubps_avx(auVar79,auVar158);
    auVar168._0_4_ = auVar79._0_4_;
    auVar168._4_4_ = auVar168._0_4_;
    auVar168._8_4_ = auVar168._0_4_;
    auVar168._12_4_ = auVar168._0_4_;
    auVar168._16_4_ = auVar168._0_4_;
    auVar168._20_4_ = auVar168._0_4_;
    auVar168._24_4_ = auVar168._0_4_;
    auVar168._28_4_ = auVar168._0_4_;
    auVar79 = vfmadd132ps_fma(auVar168,auVar147,_DAT_01faff20);
    _local_460 = ZEXT1632(auVar79);
    local_310._8_8_ = 0;
    local_310._0_8_ = *(ulong *)(local_460 + (ulong)uVar127 * 4);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }